

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContinuumEnergyAngle.test.cpp
# Opt level: O1

void verifyChunkWithLANG14(ContinuumEnergyAngle *chunk)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  long lVar11;
  variant_alternative_t<3UL,_variant<LegendreCoefficients,_KalbachMann,_ThermalScatteringData,_TabulatedDistribution>_>
  *pvVar12;
  ulong uVar13;
  char *pcVar14;
  unsigned_long n;
  char *pcVar15;
  char *pcVar16;
  long lVar17;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  StringRef capturedExpression_27;
  StringRef capturedExpression_28;
  StringRef capturedExpression_29;
  StringRef capturedExpression_30;
  StringRef capturedExpression_31;
  StringRef capturedExpression_32;
  StringRef capturedExpression_33;
  StringRef capturedExpression_34;
  StringRef capturedExpression_35;
  StringRef capturedExpression_36;
  StringRef capturedExpression_37;
  StringRef capturedExpression_38;
  StringRef capturedExpression_39;
  StringRef capturedExpression_40;
  StringRef capturedExpression_41;
  StringRef capturedExpression_42;
  StringRef capturedExpression_43;
  StringRef capturedExpression_44;
  StringRef capturedExpression_45;
  StringRef capturedExpression_46;
  StringRef capturedExpression_47;
  StringRef capturedExpression_48;
  StringRef capturedExpression_49;
  StringRef capturedExpression_50;
  StringRef capturedExpression_51;
  StringRef capturedExpression_52;
  StringRef capturedExpression_53;
  StringRef capturedExpression_54;
  StringRef capturedExpression_55;
  StringRef capturedExpression_56;
  StringRef capturedExpression_57;
  StringRef capturedExpression_58;
  StringRef capturedExpression_59;
  StringRef capturedExpression_60;
  StringRef capturedExpression_61;
  StringRef capturedExpression_62;
  StringRef capturedExpression_63;
  StringRef capturedExpression_64;
  StringRef capturedExpression_65;
  StringRef capturedExpression_66;
  StringRef capturedExpression_67;
  StringRef capturedExpression_68;
  StringRef capturedExpression_69;
  StringRef capturedExpression_70;
  StringRef capturedExpression_71;
  StringRef capturedExpression_72;
  StringRef capturedExpression_73;
  StringRef capturedExpression_74;
  StringRef capturedExpression_75;
  StringRef capturedExpression_76;
  StringRef capturedExpression_77;
  StringRef capturedExpression_78;
  StringRef capturedExpression_79;
  StringRef capturedExpression_80;
  StringRef capturedExpression_81;
  StringRef capturedExpression_82;
  StringRef capturedExpression_83;
  StringRef capturedExpression_84;
  StringRef capturedExpression_85;
  StringRef capturedExpression_86;
  StringRef capturedExpression_87;
  StringRef capturedExpression_88;
  StringRef capturedExpression_89;
  StringRef capturedExpression_90;
  StringRef capturedExpression_91;
  StringRef capturedExpression_92;
  StringRef capturedExpression_93;
  StringRef capturedExpression_94;
  StringRef capturedExpression_95;
  StringRef capturedExpression_96;
  StringRef capturedExpression_97;
  StringRef capturedExpression_98;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef macroName_27;
  StringRef macroName_28;
  StringRef macroName_29;
  StringRef macroName_30;
  StringRef macroName_31;
  StringRef macroName_32;
  StringRef macroName_33;
  StringRef macroName_34;
  StringRef macroName_35;
  StringRef macroName_36;
  StringRef macroName_37;
  StringRef macroName_38;
  StringRef macroName_39;
  StringRef macroName_40;
  StringRef macroName_41;
  StringRef macroName_42;
  StringRef macroName_43;
  StringRef macroName_44;
  StringRef macroName_45;
  StringRef macroName_46;
  StringRef macroName_47;
  StringRef macroName_48;
  StringRef macroName_49;
  StringRef macroName_50;
  StringRef macroName_51;
  StringRef macroName_52;
  StringRef macroName_53;
  StringRef macroName_54;
  StringRef macroName_55;
  StringRef macroName_56;
  StringRef macroName_57;
  StringRef macroName_58;
  StringRef macroName_59;
  StringRef macroName_60;
  StringRef macroName_61;
  StringRef macroName_62;
  StringRef macroName_63;
  StringRef macroName_64;
  StringRef macroName_65;
  StringRef macroName_66;
  StringRef macroName_67;
  StringRef macroName_68;
  StringRef macroName_69;
  StringRef macroName_70;
  StringRef macroName_71;
  StringRef macroName_72;
  StringRef macroName_73;
  StringRef macroName_74;
  StringRef macroName_75;
  StringRef macroName_76;
  StringRef macroName_77;
  StringRef macroName_78;
  StringRef macroName_79;
  StringRef macroName_80;
  StringRef macroName_81;
  StringRef macroName_82;
  StringRef macroName_83;
  StringRef macroName_84;
  StringRef macroName_85;
  StringRef macroName_86;
  StringRef macroName_87;
  StringRef macroName_88;
  StringRef macroName_89;
  StringRef macroName_90;
  StringRef macroName_91;
  StringRef macroName_92;
  StringRef macroName_93;
  StringRef macroName_94;
  StringRef macroName_95;
  StringRef macroName_96;
  StringRef macroName_97;
  StringRef macroName_98;
  AssertionHandler catchAssertionHandler_57;
  TabulatedDistribution subsection2;
  TabulatedDistribution subsection1;
  undefined1 local_560 [8];
  undefined8 local_558;
  char *local_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_548 [2];
  bool local_525;
  IResultCapture *local_520;
  undefined1 local_518 [8];
  undefined8 uStack_510;
  char *local_508;
  size_t sStack_500;
  char *local_4f8;
  double dStack_4f0;
  undefined1 local_4e8 [16];
  IResultCapture *local_4d8;
  int local_4d0;
  undefined1 local_4c8 [8];
  undefined8 local_4c0;
  double *local_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b0;
  double local_4a0;
  undefined1 local_490 [8];
  undefined8 local_488;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_480;
  WithinRelMatcher *local_478;
  range_difference_t<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
  local_470 [2];
  undefined1 local_460 [8];
  undefined8 local_458;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_450;
  WithinRelMatcher *local_448;
  range_difference_t<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
  *local_440;
  undefined1 local_438 [48];
  undefined1 local_408 [16];
  IResultCapture *local_3f8;
  int local_3f0;
  InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
  *local_3e0;
  ITransientExpression local_3d8;
  iterator_t<CRng> *local_3c8;
  WithinRelMatcher *local_3c0;
  range_difference_t<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
  *local_3b8;
  iterator_t<CRng> local_3b0;
  return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
  *local_3a8;
  char *local_3a0;
  range_difference_t<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
  *local_390;
  double local_388;
  iterator_t<CRng> local_380;
  undefined1 *local_378;
  iterator_t<CRng> local_370;
  undefined1 *local_368;
  iterator_t<CRng> local_360;
  undefined1 *local_358;
  iterator_t<CRng> local_350;
  undefined1 *local_348;
  iterator_t<CRng> local_340;
  undefined1 *local_338;
  iterator_t<CRng> local_330;
  undefined1 *local_328;
  iterator_t<CRng> local_320;
  undefined1 *local_318;
  iterator_t<CRng> local_310;
  undefined1 *local_308;
  iterator_t<CRng> local_300;
  undefined1 *local_2f8;
  iterator_t<CRng> local_2f0;
  undefined1 *local_2e8;
  iterator_t<CRng> local_2e0;
  undefined1 *local_2d8;
  iterator_t<CRng> local_2d0;
  undefined1 *local_2c8;
  iterator_t<CRng> local_2c0;
  undefined1 *local_2b8;
  iterator_t<CRng> local_2b0;
  undefined1 *local_2a8;
  iterator_t<CRng> local_2a0;
  undefined1 *local_298;
  iterator_t<CRng> local_290;
  undefined1 *local_288;
  undefined1 local_280 [9];
  bool local_277;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_270;
  WithinRelMatcher *local_268;
  ITransientExpression local_258;
  double *local_248;
  WithinRelMatcher *local_240;
  iterator_t<CRng> local_238;
  return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
  *local_230;
  char *local_228;
  char *local_218;
  iterator_t<CRng> local_210;
  return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
  *local_208;
  char *local_200;
  char *local_1f0;
  iterator_t<CRng> local_1e8;
  return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
  *local_1e0;
  char *local_1d8;
  char *local_1c8;
  iterator_t<CRng> local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a0;
  iterator_t<CRng> local_198;
  return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
  *local_190;
  char *local_188;
  range_difference_t<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
  *local_178;
  iterator_t<CRng> local_170;
  return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
  *local_168;
  char *local_160;
  range_difference_t<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
  *local_150;
  double *local_148;
  undefined8 local_140;
  char *local_138;
  char *local_128;
  double *local_120;
  undefined8 local_118;
  char *local_110;
  char *local_100;
  double *local_f8;
  undefined8 local_f0;
  char *local_e8;
  char *local_d8;
  double *local_d0;
  undefined8 local_c8;
  char *local_c0;
  char *local_b0;
  _func_int **local_a8;
  undefined8 local_a0;
  char *local_98;
  range_difference_t<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
  *local_88;
  _func_int **local_80;
  undefined8 local_78;
  char *local_70;
  range_difference_t<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
  *local_60;
  _func_int **local_58;
  undefined8 local_50;
  char *local_48;
  range_difference_t<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_>
  *local_38;
  
  local_518 = (undefined1  [8])0x1b05a4;
  uStack_510 = 0x22a;
  capturedExpression.m_size = 0x10;
  capturedExpression.m_start = "1 == chunk.LAW()";
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  local_3e0 = &chunk->data_;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_438,macroName,(SourceLineInfo *)local_518,capturedExpression,
             ContinueOnFailure);
  uStack_510 = CONCAT62(uStack_510._2_6_,0x101);
  local_518 = (undefined1  [8])&PTR_streamReconstructedExpression_001f51e8;
  uStack_510 = CONCAT44(1,(undefined4)uStack_510);
  local_508 = "==";
  sStack_500 = 2;
  local_4f8 = (char *)CONCAT44(local_4f8._4_4_,1);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_438,(ITransientExpression *)local_518);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_518);
  Catch::AssertionHandler::complete((AssertionHandler *)local_438);
  if (local_408[0xb] == false) {
    (*local_3f8->_vptr_IResultCapture[0x13])();
  }
  local_518 = (undefined1  [8])0x1b05a4;
  uStack_510 = 0x22b;
  capturedExpression_00.m_size = 0x10;
  capturedExpression_00.m_start = "2 == chunk.LEP()";
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_438,macroName_00,(SourceLineInfo *)local_518,
             capturedExpression_00,ContinueOnFailure);
  iVar1 = (int)(((InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
                  *)&local_3e0->interpolation_)->interpolation_).super_InterpolationBase.metadata.
               fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
  uStack_510._0_2_ = CONCAT11(iVar1 == 2,true);
  local_518 = (undefined1  [8])&PTR_streamReconstructedExpression_001f51e8;
  uStack_510 = CONCAT44(2,(undefined4)uStack_510);
  local_508 = "==";
  sStack_500 = 2;
  local_4f8 = (char *)CONCAT44(local_4f8._4_4_,iVar1);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_438,(ITransientExpression *)local_518);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_518);
  Catch::AssertionHandler::complete((AssertionHandler *)local_438);
  if (local_408[0xb] == false) {
    (*local_3f8->_vptr_IResultCapture[0x13])();
  }
  local_518 = (undefined1  [8])0x1b05a4;
  uStack_510 = 0x22c;
  capturedExpression_01.m_size = 0xf;
  capturedExpression_01.m_start = "2 == chunk.NE()";
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_438,macroName_01,(SourceLineInfo *)local_518,
             capturedExpression_01,ContinueOnFailure);
  local_4f8 = (char *)(((InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
                         *)&local_3e0->interpolation_)->interpolation_).super_InterpolationBase.
                      boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1];
  uStack_510._0_2_ = CONCAT11(local_4f8 == (char *)0x2,true);
  local_518 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5228;
  uStack_510 = CONCAT44(2,(undefined4)uStack_510);
  local_508 = "==";
  sStack_500 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_438,(ITransientExpression *)local_518);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_518);
  Catch::AssertionHandler::complete((AssertionHandler *)local_438);
  if (local_408[0xb] == false) {
    (*local_3f8->_vptr_IResultCapture[0x13])();
  }
  local_518 = (undefined1  [8])0x1b05a4;
  uStack_510 = 0x22d;
  capturedExpression_02.m_size = 0x23;
  capturedExpression_02.m_start = "2 == chunk.numberIncidentEnergies()";
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_438,macroName_02,(SourceLineInfo *)local_518,
             capturedExpression_02,ContinueOnFailure);
  local_4f8 = (char *)(((InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
                         *)&local_3e0->interpolation_)->interpolation_).super_InterpolationBase.
                      boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1];
  uStack_510._0_2_ = CONCAT11(local_4f8 == (char *)0x2,true);
  local_518 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5228;
  uStack_510 = CONCAT44(2,(undefined4)uStack_510);
  local_508 = "==";
  sStack_500 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_438,(ITransientExpression *)local_518);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_518);
  Catch::AssertionHandler::complete((AssertionHandler *)local_438);
  if (local_408[0xb] == false) {
    (*local_3f8->_vptr_IResultCapture[0x13])();
  }
  local_518 = (undefined1  [8])0x1b05a4;
  uStack_510 = 0x22e;
  capturedExpression_03.m_size = 0xf;
  capturedExpression_03.m_start = "1 == chunk.NR()";
  macroName_03.m_size = 5;
  macroName_03.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_438,macroName_03,(SourceLineInfo *)local_518,
             capturedExpression_03,ContinueOnFailure);
  lVar11 = (long)(((InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
                    *)&local_3e0->interpolation_)->interpolation_).super_InterpolationBase.
                 boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(((InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
                    *)&local_3e0->interpolation_)->interpolation_).super_InterpolationBase.
                 boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_4f8 = (char *)(lVar11 >> 3);
  uStack_510._0_2_ = CONCAT11(lVar11 == 8,true);
  local_518 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5228;
  uStack_510 = CONCAT44(1,(undefined4)uStack_510);
  local_508 = "==";
  sStack_500 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_438,(ITransientExpression *)local_518);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_518);
  Catch::AssertionHandler::complete((AssertionHandler *)local_438);
  if (local_408[0xb] == false) {
    (*local_3f8->_vptr_IResultCapture[0x13])();
  }
  local_518 = (undefined1  [8])0x1b05a4;
  uStack_510 = 0x22f;
  capturedExpression_04.m_size = 0x27;
  capturedExpression_04.m_start = "1 == chunk.numberInterpolationRegions()";
  macroName_04.m_size = 5;
  macroName_04.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_438,macroName_04,(SourceLineInfo *)local_518,
             capturedExpression_04,ContinueOnFailure);
  lVar11 = (long)(((InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
                    *)&local_3e0->interpolation_)->interpolation_).super_InterpolationBase.
                 boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(((InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
                    *)&local_3e0->interpolation_)->interpolation_).super_InterpolationBase.
                 boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_4f8 = (char *)(lVar11 >> 3);
  uStack_510._0_2_ = CONCAT11(lVar11 == 8,true);
  local_518 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5228;
  uStack_510 = CONCAT44(1,(undefined4)uStack_510);
  local_508 = "==";
  sStack_500 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_438,(ITransientExpression *)local_518);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_518);
  Catch::AssertionHandler::complete((AssertionHandler *)local_438);
  if (local_408[0xb] == false) {
    (*local_3f8->_vptr_IResultCapture[0x13])();
  }
  local_518 = (undefined1  [8])0x1b05a4;
  uStack_510 = 0x230;
  capturedExpression_05.m_size = 0x17;
  capturedExpression_05.m_start = "1 == chunk.INT().size()";
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_438,macroName_05,(SourceLineInfo *)local_518,
             capturedExpression_05,ContinueOnFailure);
  lVar11 = (long)(((InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
                    *)&local_3e0->interpolation_)->interpolation_).super_InterpolationBase.
                 interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(((InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
                    *)&local_3e0->interpolation_)->interpolation_).super_InterpolationBase.
                 interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_4f8 = (char *)(lVar11 >> 3);
  uStack_510._0_2_ = CONCAT11(lVar11 == 8,true);
  local_518 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5268;
  uStack_510 = CONCAT44(1,(undefined4)uStack_510);
  local_508 = "==";
  sStack_500 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_438,(ITransientExpression *)local_518);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_518);
  Catch::AssertionHandler::complete((AssertionHandler *)local_438);
  if (local_408[0xb] == false) {
    (*local_3f8->_vptr_IResultCapture[0x13])();
  }
  local_518 = (undefined1  [8])0x1b05a4;
  uStack_510 = 0x231;
  capturedExpression_06.m_size = 0x17;
  capturedExpression_06.m_start = "1 == chunk.NBT().size()";
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_438,macroName_06,(SourceLineInfo *)local_518,
             capturedExpression_06,ContinueOnFailure);
  lVar11 = (long)(((InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
                    *)&local_3e0->interpolation_)->interpolation_).super_InterpolationBase.
                 boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(((InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
                    *)&local_3e0->interpolation_)->interpolation_).super_InterpolationBase.
                 boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_4f8 = (char *)(lVar11 >> 3);
  uStack_510._0_2_ = CONCAT11(lVar11 == 8,true);
  local_518 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5268;
  uStack_510 = CONCAT44(1,(undefined4)uStack_510);
  local_508 = "==";
  sStack_500 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_438,(ITransientExpression *)local_518);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_518);
  Catch::AssertionHandler::complete((AssertionHandler *)local_438);
  if (local_408[0xb] == false) {
    (*local_3f8->_vptr_IResultCapture[0x13])();
  }
  local_518 = (undefined1  [8])0x1b05a4;
  uStack_510 = 0x232;
  capturedExpression_07.m_size = 0x13;
  capturedExpression_07.m_start = "1 == chunk.INT()[0]";
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_438,macroName_07,(SourceLineInfo *)local_518,
             capturedExpression_07,ContinueOnFailure);
  local_4f8 = (char *)*(((InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
                          *)&local_3e0->interpolation_)->interpolation_).super_InterpolationBase.
                       interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>.
                       _M_impl.super__Vector_impl_data._M_start;
  uStack_510._0_2_ = CONCAT11(local_4f8 == (char *)0x1,true);
  local_518 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5228;
  uStack_510 = CONCAT44(1,(undefined4)uStack_510);
  local_508 = "==";
  sStack_500 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_438,(ITransientExpression *)local_518);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_518);
  Catch::AssertionHandler::complete((AssertionHandler *)local_438);
  if (local_408[0xb] == false) {
    (*local_3f8->_vptr_IResultCapture[0x13])();
  }
  local_518 = (undefined1  [8])0x1b05a4;
  uStack_510 = 0x233;
  capturedExpression_08.m_size = 0x13;
  capturedExpression_08.m_start = "2 == chunk.NBT()[0]";
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_438,macroName_08,(SourceLineInfo *)local_518,
             capturedExpression_08,ContinueOnFailure);
  local_4f8 = (char *)*(((InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
                          *)&local_3e0->interpolation_)->interpolation_).super_InterpolationBase.
                       boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start;
  uStack_510._0_2_ = CONCAT11(local_4f8 == (char *)0x2,true);
  local_518 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5228;
  uStack_510 = CONCAT44(2,(undefined4)uStack_510);
  local_508 = "==";
  sStack_500 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_438,(ITransientExpression *)local_518);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_518);
  Catch::AssertionHandler::complete((AssertionHandler *)local_438);
  if (local_408[0xb] == false) {
    (*local_3f8->_vptr_IResultCapture[0x13])();
  }
  local_518 = (undefined1  [8])0x1b05a4;
  uStack_510 = 0x234;
  capturedExpression_09.m_size = 0x20;
  capturedExpression_09.m_start = "1 == chunk.interpolants().size()";
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_438,macroName_09,(SourceLineInfo *)local_518,
             capturedExpression_09,ContinueOnFailure);
  lVar11 = (long)(((InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
                    *)&local_3e0->interpolation_)->interpolation_).super_InterpolationBase.
                 interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(((InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
                    *)&local_3e0->interpolation_)->interpolation_).super_InterpolationBase.
                 interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_4f8 = (char *)(lVar11 >> 3);
  uStack_510._0_2_ = CONCAT11(lVar11 == 8,true);
  local_518 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5268;
  uStack_510 = CONCAT44(1,(undefined4)uStack_510);
  local_508 = "==";
  sStack_500 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_438,(ITransientExpression *)local_518);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_518);
  Catch::AssertionHandler::complete((AssertionHandler *)local_438);
  if (local_408[0xb] == false) {
    (*local_3f8->_vptr_IResultCapture[0x13])();
  }
  local_518 = (undefined1  [8])0x1b05a4;
  uStack_510 = 0x235;
  capturedExpression_10.m_size = 0x1e;
  capturedExpression_10.m_start = "1 == chunk.boundaries().size()";
  macroName_10.m_size = 5;
  macroName_10.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_438,macroName_10,(SourceLineInfo *)local_518,
             capturedExpression_10,ContinueOnFailure);
  lVar11 = (long)(((InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
                    *)&local_3e0->interpolation_)->interpolation_).super_InterpolationBase.
                 boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(((InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
                    *)&local_3e0->interpolation_)->interpolation_).super_InterpolationBase.
                 boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_4f8 = (char *)(lVar11 >> 3);
  uStack_510._0_2_ = CONCAT11(lVar11 == 8,true);
  local_518 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5268;
  uStack_510 = CONCAT44(1,(undefined4)uStack_510);
  local_508 = "==";
  sStack_500 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_438,(ITransientExpression *)local_518);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_518);
  Catch::AssertionHandler::complete((AssertionHandler *)local_438);
  if (local_408[0xb] == false) {
    (*local_3f8->_vptr_IResultCapture[0x13])();
  }
  local_518 = (undefined1  [8])0x1b05a4;
  uStack_510 = 0x236;
  capturedExpression_11.m_size = 0x1c;
  capturedExpression_11.m_start = "1 == chunk.interpolants()[0]";
  macroName_11.m_size = 5;
  macroName_11.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_438,macroName_11,(SourceLineInfo *)local_518,
             capturedExpression_11,ContinueOnFailure);
  local_4f8 = (char *)*(((InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
                          *)&local_3e0->interpolation_)->interpolation_).super_InterpolationBase.
                       interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>.
                       _M_impl.super__Vector_impl_data._M_start;
  uStack_510._0_2_ = CONCAT11(local_4f8 == (char *)0x1,true);
  local_518 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5228;
  uStack_510 = CONCAT44(1,(undefined4)uStack_510);
  local_508 = "==";
  sStack_500 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_438,(ITransientExpression *)local_518);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_518);
  Catch::AssertionHandler::complete((AssertionHandler *)local_438);
  if (local_408[0xb] == false) {
    (*local_3f8->_vptr_IResultCapture[0x13])();
  }
  local_518 = (undefined1  [8])0x1b05a4;
  uStack_510 = 0x237;
  capturedExpression_12.m_size = 0x1a;
  capturedExpression_12.m_start = "2 == chunk.boundaries()[0]";
  macroName_12.m_size = 5;
  macroName_12.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_438,macroName_12,(SourceLineInfo *)local_518,
             capturedExpression_12,ContinueOnFailure);
  local_4f8 = (char *)*(((InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
                          *)&local_3e0->interpolation_)->interpolation_).super_InterpolationBase.
                       boundaryIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start;
  uStack_510._0_2_ = CONCAT11(local_4f8 == (char *)0x2,true);
  local_518 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5228;
  uStack_510 = CONCAT44(2,(undefined4)uStack_510);
  local_508 = "==";
  sStack_500 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_438,(ITransientExpression *)local_518);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_518);
  Catch::AssertionHandler::complete((AssertionHandler *)local_438);
  if (local_408[0xb] == false) {
    (*local_3f8->_vptr_IResultCapture[0x13])();
  }
  pvVar12 = std::
            get<3ul,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>
                      ((local_3e0->sequence_).
                       super__Vector_base<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  local_438._0_8_ =
       *(undefined8 *)
        &(pvVar12->super_Base).super_ListRecord.metadata.fields.
         super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
         super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
         super__Tuple_impl<2UL,_long,_long,_long,_long>;
  local_438._8_8_ =
       (pvVar12->super_Base).super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
  local_438._16_8_ =
       (pvVar12->super_Base).super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl;
  local_438._24_8_ =
       (pvVar12->super_Base).super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  local_438._32_8_ =
       (pvVar12->super_Base).super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl;
  local_438._40_8_ =
       (pvVar12->super_Base).super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_408,
             &(pvVar12->super_Base).super_ListRecord.data);
  local_3f0 = pvVar12->lang_;
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x23c;
  capturedExpression_13.m_size = 0x22;
  capturedExpression_13.m_start = "1e-5, WithinRel( subsection1.E() )";
  macroName_13.m_size = 10;
  macroName_13.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_13,(SourceLineInfo *)local_560,
             capturedExpression_13,ContinueOnFailure);
  local_490 = (undefined1  [8])0x3ee4f8b588e368f1;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_560,(double)local_438._32_8_);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_560,(double *)local_490);
  local_4c0._1_1_ = bVar10;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_4b8 = (double *)local_490;
  local_4b0._M_allocated_capacity = (size_type)(WithinRelMatcher *)local_560;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x23d;
  capturedExpression_14.m_size = 0x2f;
  capturedExpression_14.m_start = "1e-5, WithinRel( subsection1.incidentEnergy() )";
  macroName_14.m_size = 10;
  macroName_14.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_14,(SourceLineInfo *)local_560,
             capturedExpression_14,ContinueOnFailure);
  local_490 = (undefined1  [8])0x3ee4f8b588e368f1;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_560,(double)local_438._32_8_);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_560,(double *)local_490);
  local_4c0._1_1_ = bVar10;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_4b8 = (double *)local_490;
  local_4b0._M_allocated_capacity = (size_type)(WithinRelMatcher *)local_560;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x23e;
  capturedExpression_15.m_size = 0x18;
  capturedExpression_15.m_start = "14 == subsection1.LANG()";
  macroName_15.m_size = 5;
  macroName_15.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_15,(SourceLineInfo *)local_560,
             capturedExpression_15,ContinueOnFailure);
  local_558._1_1_ = local_3f0 == 0xe;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001f51e8;
  local_558._4_4_ = 0xe;
  local_550 = "==";
  local_548[0]._M_allocated_capacity = 2;
  local_548[0]._8_4_ = local_3f0;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x23f;
  capturedExpression_16.m_size = 0x22;
  capturedExpression_16.m_start = "14 == subsection1.representation()";
  macroName_16.m_size = 5;
  macroName_16.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_16,(SourceLineInfo *)local_560,
             capturedExpression_16,ContinueOnFailure);
  local_558._1_1_ = local_3f0 == 0xe;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001f51e8;
  local_558._4_4_ = 0xe;
  local_550 = "==";
  local_548[0]._M_allocated_capacity = 2;
  local_548[0]._8_4_ = local_3f0;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x240;
  capturedExpression_17.m_size = 0x15;
  capturedExpression_17.m_start = "0 == subsection1.ND()";
  macroName_17.m_size = 5;
  macroName_17.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_17,(SourceLineInfo *)local_560,
             capturedExpression_17,ContinueOnFailure);
  local_558._1_1_ = local_438._24_8_ == 0;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5228;
  local_558 = local_558 & 0xffffffff;
  local_550 = "==";
  local_548[0]._M_allocated_capacity = 2;
  local_548[0]._8_8_ = local_438._24_8_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x241;
  capturedExpression_18.m_size = 0x29;
  capturedExpression_18.m_start = "0 == subsection1.numberDiscreteEnergies()";
  macroName_18.m_size = 5;
  macroName_18.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_18,(SourceLineInfo *)local_560,
             capturedExpression_18,ContinueOnFailure);
  local_558._1_1_ = local_438._24_8_ == 0;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5228;
  local_558 = local_558 & 0xffffffff;
  local_550 = "==";
  local_548[0]._M_allocated_capacity = 2;
  local_548[0]._8_8_ = local_438._24_8_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x242;
  capturedExpression_19.m_size = 0x15;
  capturedExpression_19.m_start = "4 == subsection1.NA()";
  macroName_19.m_size = 5;
  macroName_19.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_19,(SourceLineInfo *)local_560,
             capturedExpression_19,ContinueOnFailure);
  local_558._1_1_ = (char *)local_438._16_8_ == (char *)0x4;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5228;
  local_558._4_4_ = 4;
  local_550 = "==";
  local_548[0]._M_allocated_capacity = 2;
  local_548[0]._8_8_ = local_438._16_8_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x243;
  capturedExpression_20.m_size = 0x2a;
  capturedExpression_20.m_start = "4 == subsection1.numberAngularParameters()";
  macroName_20.m_size = 5;
  macroName_20.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_20,(SourceLineInfo *)local_560,
             capturedExpression_20,ContinueOnFailure);
  local_558._1_1_ = (char *)local_438._16_8_ == (char *)0x4;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5228;
  local_558._4_4_ = 4;
  local_550 = "==";
  local_548[0]._M_allocated_capacity = 2;
  local_548[0]._8_8_ = local_438._16_8_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x244;
  capturedExpression_21.m_size = 0x16;
  capturedExpression_21.m_start = "12 == subsection1.NW()";
  macroName_21.m_size = 5;
  macroName_21.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_21,(SourceLineInfo *)local_560,
             capturedExpression_21,ContinueOnFailure);
  lVar11 = CONCAT44(local_408._12_4_,local_408._8_4_) - local_408._0_8_;
  local_548[0]._8_8_ = lVar11 >> 3;
  local_558._1_1_ = lVar11 == 0x60;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5228;
  local_558._4_4_ = 0xc;
  local_550 = "==";
  local_548[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x245;
  capturedExpression_22.m_size = 0x16;
  capturedExpression_22.m_start = "2 == subsection1.NEP()";
  macroName_22.m_size = 5;
  macroName_22.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_22,(SourceLineInfo *)local_560,
             capturedExpression_22,ContinueOnFailure);
  local_558._1_1_ = (char *)local_438._0_8_ == (char *)0x2;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5228;
  local_558._4_4_ = 2;
  local_550 = "==";
  local_548[0]._M_allocated_capacity = 2;
  local_548[0]._8_8_ = local_438._0_8_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x246;
  capturedExpression_23.m_size = 0x2a;
  capturedExpression_23.m_start = "2 == subsection1.numberSecondaryEnergies()";
  macroName_23.m_size = 5;
  macroName_23.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_23,(SourceLineInfo *)local_560,
             capturedExpression_23,ContinueOnFailure);
  local_558._1_1_ = (char *)local_438._0_8_ == (char *)0x2;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5228;
  local_558._4_4_ = 2;
  local_550 = "==";
  local_548[0]._M_allocated_capacity = 2;
  local_548[0]._8_8_ = local_438._0_8_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x247;
  capturedExpression_24.m_size = 0x1c;
  capturedExpression_24.m_start = "2 == subsection1.EP().size()";
  macroName_24.m_size = 5;
  macroName_24.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_24,(SourceLineInfo *)local_560,
             capturedExpression_24,ContinueOnFailure);
  local_548[0]._8_8_ =
       (ulong)(local_438._16_8_ +
              (CONCAT44(local_408._12_4_,local_408._8_4_) - local_408._0_8_ >> 3) + 1) /
       (ulong)(local_438._16_8_ + 2);
  local_558._1_1_ = local_548[0]._8_8_ == 2;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5268;
  local_558._4_4_ = 2;
  local_550 = "==";
  local_548[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x248;
  capturedExpression_25.m_size = 0x22;
  capturedExpression_25.m_start = "2 == subsection1.energies().size()";
  macroName_25.m_size = 5;
  macroName_25.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_25,(SourceLineInfo *)local_560,
             capturedExpression_25,ContinueOnFailure);
  local_548[0]._8_8_ =
       (ulong)(local_438._16_8_ +
              (CONCAT44(local_408._12_4_,local_408._8_4_) - local_408._0_8_ >> 3) + 1) /
       (ulong)(local_438._16_8_ + 2);
  local_558._1_1_ = local_548[0]._8_8_ == 2;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5268;
  local_558._4_4_ = 2;
  local_550 = "==";
  local_548[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x249;
  capturedExpression_26.m_size = 0x24;
  capturedExpression_26.m_start = "1., WithinRel( subsection1.EP()[0] )";
  macroName_26.m_size = 10;
  macroName_26.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_26,(SourceLineInfo *)local_560,
             capturedExpression_26,ContinueOnFailure);
  local_490 = (undefined1  [8])0x3ff0000000000000;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_560,*(double *)local_408._0_8_);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_560,(double *)local_490);
  local_4c0._1_1_ = bVar10;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_4b8 = (double *)local_490;
  local_4b0._M_allocated_capacity = (size_type)(WithinRelMatcher *)local_560;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x24a;
  capturedExpression_27.m_size = 0x24;
  capturedExpression_27.m_start = "7., WithinRel( subsection1.EP()[1] )";
  macroName_27.m_size = 10;
  macroName_27.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_27,(SourceLineInfo *)local_560,
             capturedExpression_27,ContinueOnFailure);
  local_460 = (undefined1  [8])0x401c000000000000;
  local_480._M_current = (double *)(local_438._16_8_ + 2);
  local_488 = (double *)local_408;
  lVar11 = CONCAT44(local_408._12_4_,local_408._8_4_) - local_408._0_8_;
  auVar2._8_8_ = lVar11 >> 0x3f;
  auVar2._0_8_ = lVar11 >> 3;
  lVar11 = SUB168(auVar2 % SEXT816((long)local_480._M_current),0);
  local_478 = (WithinRelMatcher *)((long)local_480._M_current - lVar11);
  if (lVar11 == 0) {
    local_478 = (WithinRelMatcher *)0x0;
  }
  local_380._M_current = (double *)local_408._0_8_;
  local_378 = local_490;
  ranges::stride_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>::
  adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_378,&local_380,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_560,*local_380._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_560,(double *)local_460);
  local_4c0._1_1_ = bVar10;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_4b8 = (double *)local_460;
  local_4b0._M_allocated_capacity = (size_type)(WithinRelMatcher *)local_560;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x24b;
  capturedExpression_28.m_size = 0x2a;
  capturedExpression_28.m_start = "1., WithinRel( subsection1.energies()[0] )";
  macroName_28.m_size = 10;
  macroName_28.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_28,(SourceLineInfo *)local_560,
             capturedExpression_28,ContinueOnFailure);
  local_490 = (undefined1  [8])0x3ff0000000000000;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_560,*(double *)local_408._0_8_);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_560,(double *)local_490);
  local_4c0._1_1_ = bVar10;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_4b8 = (double *)local_490;
  local_4b0._M_allocated_capacity = (size_type)(WithinRelMatcher *)local_560;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x24c;
  capturedExpression_29.m_size = 0x2a;
  capturedExpression_29.m_start = "7., WithinRel( subsection1.energies()[1] )";
  macroName_29.m_size = 10;
  macroName_29.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_29,(SourceLineInfo *)local_560,
             capturedExpression_29,ContinueOnFailure);
  local_460 = (undefined1  [8])0x401c000000000000;
  local_480._M_current = (double *)(local_438._16_8_ + 2);
  local_488 = (double *)local_408;
  lVar11 = CONCAT44(local_408._12_4_,local_408._8_4_) - local_408._0_8_;
  auVar3._8_8_ = lVar11 >> 0x3f;
  auVar3._0_8_ = lVar11 >> 3;
  lVar11 = SUB168(auVar3 % SEXT816((long)local_480._M_current),0);
  local_478 = (WithinRelMatcher *)((long)local_480._M_current - lVar11);
  if (lVar11 == 0) {
    local_478 = (WithinRelMatcher *)0x0;
  }
  local_370._M_current = (double *)local_408._0_8_;
  local_368 = local_490;
  ranges::stride_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>::
  adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_368,&local_370,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_560,*local_370._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_560,(double *)local_460);
  local_4c0._1_1_ = bVar10;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_4b8 = (double *)local_460;
  local_4b0._M_allocated_capacity = (size_type)(WithinRelMatcher *)local_560;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x24d;
  capturedExpression_30.m_size = 0x1c;
  capturedExpression_30.m_start = "2 == subsection1.F0().size()";
  macroName_30.m_size = 5;
  macroName_30.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_30,(SourceLineInfo *)local_560,
             capturedExpression_30,ContinueOnFailure);
  local_548[0]._8_8_ =
       (ulong)(local_438._16_8_ +
              ((CONCAT44(local_408._12_4_,local_408._8_4_) - local_408._0_8_) + -8 >> 3) + 1) /
       (ulong)(local_438._16_8_ + 2);
  local_558._1_1_ = local_548[0]._8_8_ == 2;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5268;
  local_558._4_4_ = 2;
  local_550 = "==";
  local_548[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x24e;
  capturedExpression_31.m_size = 0x34;
  capturedExpression_31.m_start = "2 == subsection1.totalEmissionProbabilities().size()";
  macroName_31.m_size = 5;
  macroName_31.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_31,(SourceLineInfo *)local_560,
             capturedExpression_31,ContinueOnFailure);
  local_548[0]._8_8_ =
       (ulong)(local_438._16_8_ +
              ((CONCAT44(local_408._12_4_,local_408._8_4_) - local_408._0_8_) + -8 >> 3) + 1) /
       (ulong)(local_438._16_8_ + 2);
  local_558._1_1_ = local_548[0]._8_8_ == 2;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5268;
  local_558._4_4_ = 2;
  local_550 = "==";
  local_548[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x24f;
  capturedExpression_32.m_size = 0x24;
  capturedExpression_32.m_start = "2., WithinRel( subsection1.F0()[0] )";
  macroName_32.m_size = 10;
  macroName_32.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_32,(SourceLineInfo *)local_560,
             capturedExpression_32,ContinueOnFailure);
  local_490 = (undefined1  [8])0x4000000000000000;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_560,*(double *)(local_408._0_8_ + 8));
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_560,(double *)local_490);
  local_4c0._1_1_ = bVar10;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_4b8 = (double *)local_490;
  local_4b0._M_allocated_capacity = (size_type)(WithinRelMatcher *)local_560;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x250;
  capturedExpression_33.m_size = 0x24;
  capturedExpression_33.m_start = "8., WithinRel( subsection1.F0()[1] )";
  macroName_33.m_size = 10;
  macroName_33.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_33,(SourceLineInfo *)local_560,
             capturedExpression_33,ContinueOnFailure);
  local_460 = (undefined1  [8])0x4020000000000000;
  local_4b8 = (double *)(local_408._0_8_ + 8);
  local_4c0 = (pointer)CONCAT44(local_408._12_4_,local_408._8_4_);
  local_4b0._M_allocated_capacity = local_438._16_8_ + 2;
  local_358 = local_4c8;
  auVar4._8_8_ = (long)local_4c0 - (long)local_4b8 >> 0x3f;
  auVar4._0_8_ = (long)local_4c0 - (long)local_4b8 >> 3;
  lVar11 = SUB168(auVar4 % SEXT816((long)local_4b0._M_allocated_capacity),0);
  local_4b0._8_8_ = local_4b0._M_allocated_capacity - lVar11;
  if (lVar11 == 0) {
    local_4b0._8_8_ = 0;
  }
  local_360._M_current = local_4b8;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_358,&local_360,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_560,*local_360._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_560,(double *)local_460);
  local_488._1_1_ = bVar10;
  local_488._0_1_ = true;
  local_490 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_480._M_current = (double *)local_460;
  local_478 = (WithinRelMatcher *)local_560;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_490);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_490);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x251;
  capturedExpression_34.m_size = 0x3c;
  capturedExpression_34.m_start = "2., WithinRel( subsection1.totalEmissionProbabilities()[0] )";
  macroName_34.m_size = 10;
  macroName_34.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_34,(SourceLineInfo *)local_560,
             capturedExpression_34,ContinueOnFailure);
  local_490 = (undefined1  [8])0x4000000000000000;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_560,*(double *)(local_408._0_8_ + 8));
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_560,(double *)local_490);
  local_4c0._1_1_ = bVar10;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_4b8 = (double *)local_490;
  local_4b0._M_allocated_capacity = (size_type)(WithinRelMatcher *)local_560;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x252;
  capturedExpression_35.m_size = 0x3c;
  capturedExpression_35.m_start = "8., WithinRel( subsection1.totalEmissionProbabilities()[1] )";
  macroName_35.m_size = 10;
  macroName_35.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_35,(SourceLineInfo *)local_560,
             capturedExpression_35,ContinueOnFailure);
  local_460 = (undefined1  [8])0x4020000000000000;
  local_4b8 = (double *)(local_408._0_8_ + 8);
  local_4c0 = (pointer)CONCAT44(local_408._12_4_,local_408._8_4_);
  local_4b0._M_allocated_capacity = local_438._16_8_ + 2;
  auVar5._8_8_ = (long)local_4c0 - (long)local_4b8 >> 0x3f;
  auVar5._0_8_ = (long)local_4c0 - (long)local_4b8 >> 3;
  lVar11 = SUB168(auVar5 % SEXT816((long)local_4b0._M_allocated_capacity),0);
  local_4b0._8_8_ = local_4b0._M_allocated_capacity - lVar11;
  if (lVar11 == 0) {
    local_4b0._8_8_ = 0;
  }
  local_348 = local_4c8;
  local_350._M_current = local_4b8;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_348,&local_350,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_560,*local_350._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_560,(double *)local_460);
  local_488._1_1_ = bVar10;
  local_488._0_1_ = true;
  local_490 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_480._M_current = (double *)local_460;
  local_478 = (WithinRelMatcher *)local_560;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_490);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_490);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x253;
  capturedExpression_36.m_size = 0x1c;
  capturedExpression_36.m_start = "2 == subsection1.MU().size()";
  macroName_36.m_size = 5;
  macroName_36.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_36,(SourceLineInfo *)local_560,
             capturedExpression_36,ContinueOnFailure);
  uVar13 = CONCAT44(local_408._12_4_,local_408._8_4_) - local_408._0_8_ >> 3;
  local_548[0]._8_8_ =
       (uVar13 / (ulong)(local_438._16_8_ + 2) + 1) -
       (ulong)(uVar13 % (ulong)(local_438._16_8_ + 2) == 0);
  local_558._1_1_ = local_548[0]._8_8_ == 2;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5268;
  local_558._4_4_ = 2;
  local_550 = "==";
  local_548[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x254;
  capturedExpression_37.m_size = 0x21;
  capturedExpression_37.m_start = "2 == subsection1.cosines().size()";
  macroName_37.m_size = 5;
  macroName_37.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_37,(SourceLineInfo *)local_560,
             capturedExpression_37,ContinueOnFailure);
  uVar13 = CONCAT44(local_408._12_4_,local_408._8_4_) - local_408._0_8_ >> 3;
  local_548[0]._8_8_ =
       (uVar13 / (ulong)(local_438._16_8_ + 2) + 1) -
       (ulong)(uVar13 % (ulong)(local_438._16_8_ + 2) == 0);
  local_558._1_1_ = local_548[0]._8_8_ == 2;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5268;
  local_558._4_4_ = 2;
  local_550 = "==";
  local_548[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x255;
  capturedExpression_38.m_size = 0x27;
  capturedExpression_38.m_start = "3., WithinRel( subsection1.MU()[0][0] )";
  macroName_38.m_size = 10;
  macroName_38.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_38,(SourceLineInfo *)local_560,
             capturedExpression_38,ContinueOnFailure);
  local_490 = (undefined1  [8])0x4008000000000000;
  pcVar15 = (char *)(CONCAT44(local_408._12_4_,local_408._8_4_) - local_408._0_8_ >> 3);
  if ((char *)(local_438._16_8_ + 2) < pcVar15) {
    pcVar15 = (char *)(local_438._16_8_ + 2);
  }
  pcVar16 = (char *)0x2;
  if ((long)pcVar15 < 2) {
    pcVar16 = pcVar15;
  }
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_560,*(double *)(local_408._0_8_ + pcVar16 * 8));
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_560,(double *)local_490);
  local_4c0._1_1_ = bVar10;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_4b8 = (double *)local_490;
  local_4b0._M_allocated_capacity = (size_type)(WithinRelMatcher *)local_560;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x256;
  capturedExpression_39.m_size = 0x27;
  capturedExpression_39.m_start = "5., WithinRel( subsection1.MU()[0][1] )";
  macroName_39.m_size = 10;
  macroName_39.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_39,(SourceLineInfo *)local_560,
             capturedExpression_39,ContinueOnFailure);
  local_460 = (undefined1  [8])0x4014000000000000;
  pcVar15 = (char *)(CONCAT44(local_408._12_4_,local_408._8_4_) - local_408._0_8_ >> 3);
  if ((char *)(local_438._16_8_ + 2) < pcVar15) {
    pcVar15 = (char *)(local_438._16_8_ + 2);
  }
  pcVar16 = (char *)0x2;
  if ((long)pcVar15 < 2) {
    pcVar16 = pcVar15;
  }
  local_4b8 = (double *)(local_408._0_8_ + pcVar16 * 8);
  lVar17 = (long)pcVar15 * 8 + (long)pcVar16 * -8;
  local_4c0 = (pointer)(local_408._0_8_ + pcVar15 * 8);
  local_4b0._M_allocated_capacity = 2;
  lVar11 = lVar17 >> 3;
  lVar11 = lVar11 - (lVar11 - (lVar17 >> 0x3f) & 0xfffffffffffffffeU);
  local_4b0._8_8_ = 2 - lVar11;
  if (lVar11 == 0) {
    local_4b0._8_8_ = 0;
  }
  local_338 = local_4c8;
  local_340._M_current = local_4b8;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_338,&local_340,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_560,*local_340._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_560,(double *)local_460);
  local_488._1_1_ = bVar10;
  local_488._0_1_ = true;
  local_490 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_480._M_current = (double *)local_460;
  local_478 = (WithinRelMatcher *)local_560;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_490);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_490);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x257;
  capturedExpression_40.m_size = 0x27;
  capturedExpression_40.m_start = "9., WithinRel( subsection1.MU()[1][0] )";
  macroName_40.m_size = 10;
  macroName_40.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_40,(SourceLineInfo *)local_560,
             capturedExpression_40,ContinueOnFailure);
  local_3d8._vptr_ITransientExpression = (_func_int **)0x4022000000000000;
  local_4b0._M_allocated_capacity = local_438._16_8_ + 2;
  pcVar15 = local_4b0._M_local_buf + 8;
  local_4b8 = (double *)local_408;
  local_4b0._8_8_ = 0x200000000;
  local_4a0 = 4.24399158193054e-314;
  local_148 = (double *)local_408._0_8_;
  local_140 = 0;
  local_138 = (char *)local_4b0._M_allocated_capacity;
  local_128 = pcVar15;
  ranges::
  basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::adaptor<true>>>,ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>,ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,int>>,ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,int>>>>>::adaptor<false>>>
  ::operator[]<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
              *)local_490,&local_148,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_560,*local_480._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_560,(double *)&local_3d8);
  local_458._1_1_ = bVar10;
  local_458._0_1_ = true;
  local_460 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_450._M_current = (double *)&local_3d8;
  local_448 = (WithinRelMatcher *)local_560;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_460);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_460);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x258;
  capturedExpression_41.m_size = 0x28;
  capturedExpression_41.m_start = "11., WithinRel( subsection1.MU()[1][1] )";
  macroName_41.m_size = 10;
  macroName_41.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_41,(SourceLineInfo *)local_560,
             capturedExpression_41,ContinueOnFailure);
  local_3d8._vptr_ITransientExpression = (_func_int **)0x4026000000000000;
  local_4b0._M_allocated_capacity = local_438._16_8_ + 2;
  local_4b8 = (double *)local_408;
  local_4b0._8_8_ = 0x200000000;
  local_4a0 = 4.24399158193054e-314;
  local_238._M_current = (double *)local_408._0_8_;
  local_230 = (return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
               *)0x0;
  local_228 = (char *)local_4b0._M_allocated_capacity;
  local_218 = pcVar15;
  ranges::
  basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::adaptor<true>>>,ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>,ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,int>>,ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,int>>>>>::adaptor<false>>>
  ::operator[]<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
              *)local_490,&local_238,1);
  local_238._M_current = local_480._M_current;
  local_230 = (return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
               *)local_490;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_230,&local_238,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_560,*local_238._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_560,(double *)&local_3d8);
  local_458._1_1_ = bVar10;
  local_458._0_1_ = true;
  local_460 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_450._M_current = (double *)&local_3d8;
  local_448 = (WithinRelMatcher *)local_560;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_460);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_460);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x259;
  capturedExpression_42.m_size = 0x2c;
  capturedExpression_42.m_start = "3., WithinRel( subsection1.cosines()[0][0] )";
  macroName_42.m_size = 10;
  macroName_42.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_42,(SourceLineInfo *)local_560,
             capturedExpression_42,ContinueOnFailure);
  local_490 = (undefined1  [8])0x4008000000000000;
  pcVar16 = (char *)(CONCAT44(local_408._12_4_,local_408._8_4_) - local_408._0_8_ >> 3);
  if ((char *)(local_438._16_8_ + 2) < pcVar16) {
    pcVar16 = (char *)(local_438._16_8_ + 2);
  }
  pcVar14 = (char *)0x2;
  if ((long)pcVar16 < 2) {
    pcVar14 = pcVar16;
  }
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_560,*(double *)(local_408._0_8_ + pcVar14 * 8));
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_560,(double *)local_490);
  local_4c0._1_1_ = bVar10;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_4b8 = (double *)local_490;
  local_4b0._M_allocated_capacity = (size_type)(WithinRelMatcher *)local_560;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x25a;
  capturedExpression_43.m_size = 0x2c;
  capturedExpression_43.m_start = "5., WithinRel( subsection1.cosines()[0][1] )";
  macroName_43.m_size = 10;
  macroName_43.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_43,(SourceLineInfo *)local_560,
             capturedExpression_43,ContinueOnFailure);
  local_460 = (undefined1  [8])0x4014000000000000;
  pcVar16 = (char *)(CONCAT44(local_408._12_4_,local_408._8_4_) - local_408._0_8_ >> 3);
  if ((char *)(local_438._16_8_ + 2) < pcVar16) {
    pcVar16 = (char *)(local_438._16_8_ + 2);
  }
  pcVar14 = (char *)0x2;
  if ((long)pcVar16 < 2) {
    pcVar14 = pcVar16;
  }
  local_4b8 = (double *)(local_408._0_8_ + pcVar14 * 8);
  lVar17 = (long)pcVar16 * 8 + (long)pcVar14 * -8;
  local_4c0 = (pointer)(local_408._0_8_ + pcVar16 * 8);
  local_4b0._M_allocated_capacity = 2;
  lVar11 = lVar17 >> 3;
  lVar11 = lVar11 - (lVar11 - (lVar17 >> 0x3f) & 0xfffffffffffffffeU);
  local_4b0._8_8_ = 2 - lVar11;
  if (lVar11 == 0) {
    local_4b0._8_8_ = 0;
  }
  local_328 = local_4c8;
  local_330._M_current = local_4b8;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_328,&local_330,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_560,*local_330._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_560,(double *)local_460);
  local_488._1_1_ = bVar10;
  local_488._0_1_ = true;
  local_490 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_480._M_current = (double *)local_460;
  local_478 = (WithinRelMatcher *)local_560;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_490);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_490);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x25b;
  capturedExpression_44.m_size = 0x2c;
  capturedExpression_44.m_start = "9., WithinRel( subsection1.cosines()[1][0] )";
  macroName_44.m_size = 10;
  macroName_44.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_44,(SourceLineInfo *)local_560,
             capturedExpression_44,ContinueOnFailure);
  local_3d8._vptr_ITransientExpression = (_func_int **)0x4022000000000000;
  local_4b0._M_allocated_capacity = local_438._16_8_ + 2;
  local_4b8 = (double *)local_408;
  local_4b0._8_8_ = 0x200000000;
  local_4a0 = 4.24399158193054e-314;
  local_120 = (double *)local_408._0_8_;
  local_118 = 0;
  local_110 = (char *)local_4b0._M_allocated_capacity;
  local_100 = pcVar15;
  ranges::
  basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::adaptor<true>>>,ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>,ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,int>>,ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,int>>>>>::adaptor<false>>>
  ::operator[]<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
              *)local_490,&local_120,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_560,*local_480._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_560,(double *)&local_3d8);
  local_458._1_1_ = bVar10;
  local_458._0_1_ = true;
  local_460 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_450._M_current = (double *)&local_3d8;
  local_448 = (WithinRelMatcher *)local_560;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_460);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_460);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x25c;
  capturedExpression_45.m_size = 0x2d;
  capturedExpression_45.m_start = "11., WithinRel( subsection1.cosines()[1][1] )";
  macroName_45.m_size = 10;
  macroName_45.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_45,(SourceLineInfo *)local_560,
             capturedExpression_45,ContinueOnFailure);
  local_3d8._vptr_ITransientExpression = (_func_int **)0x4026000000000000;
  local_4b0._M_allocated_capacity = local_438._16_8_ + 2;
  local_4b8 = (double *)local_408;
  local_4b0._8_8_ = 0x200000000;
  local_4a0 = 4.24399158193054e-314;
  local_210._M_current = (double *)local_408._0_8_;
  local_208 = (return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
               *)0x0;
  local_200 = (char *)local_4b0._M_allocated_capacity;
  local_1f0 = pcVar15;
  ranges::
  basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::adaptor<true>>>,ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>,ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,int>>,ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,int>>>>>::adaptor<false>>>
  ::operator[]<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
              *)local_490,&local_210,1);
  local_210._M_current = local_480._M_current;
  local_208 = (return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
               *)local_490;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_208,&local_210,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_560,*local_210._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_560,(double *)&local_3d8);
  local_458._1_1_ = bVar10;
  local_458._0_1_ = true;
  local_460 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_450._M_current = (double *)&local_3d8;
  local_448 = (WithinRelMatcher *)local_560;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_460);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_460);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x25d;
  capturedExpression_46.m_size = 0x1b;
  capturedExpression_46.m_start = "2 == subsection1.F().size()";
  macroName_46.m_size = 5;
  macroName_46.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_46,(SourceLineInfo *)local_560,
             capturedExpression_46,ContinueOnFailure);
  uVar13 = CONCAT44(local_408._12_4_,local_408._8_4_) - local_408._0_8_ >> 3;
  local_548[0]._8_8_ =
       (uVar13 / (ulong)(local_438._16_8_ + 2) + 1) -
       (ulong)(uVar13 % (ulong)(local_438._16_8_ + 2) == 0);
  local_558._1_1_ = local_548[0]._8_8_ == 2;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5268;
  local_558._4_4_ = 2;
  local_550 = "==";
  local_548[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x25e;
  capturedExpression_47.m_size = 0x27;
  capturedExpression_47.m_start = "2 == subsection1.probabilities().size()";
  macroName_47.m_size = 5;
  macroName_47.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_47,(SourceLineInfo *)local_560,
             capturedExpression_47,ContinueOnFailure);
  uVar13 = CONCAT44(local_408._12_4_,local_408._8_4_) - local_408._0_8_ >> 3;
  local_548[0]._8_8_ =
       (uVar13 / (ulong)(local_438._16_8_ + 2) + 1) -
       (ulong)(uVar13 % (ulong)(local_438._16_8_ + 2) == 0);
  local_558._1_1_ = local_548[0]._8_8_ == 2;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5268;
  local_558._4_4_ = 2;
  local_550 = "==";
  local_548[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x25f;
  capturedExpression_48.m_size = 0x26;
  capturedExpression_48.m_start = "4., WithinRel( subsection1.F()[0][0] )";
  macroName_48.m_size = 10;
  macroName_48.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_48,(SourceLineInfo *)local_560,
             capturedExpression_48,ContinueOnFailure);
  local_490 = (undefined1  [8])0x4010000000000000;
  pcVar16 = (char *)(CONCAT44(local_408._12_4_,local_408._8_4_) - local_408._0_8_ >> 3);
  if ((char *)(local_438._16_8_ + 2) < pcVar16) {
    pcVar16 = (char *)(local_438._16_8_ + 2);
  }
  pcVar14 = (char *)0x3;
  if ((long)pcVar16 < 3) {
    pcVar14 = pcVar16;
  }
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_560,*(double *)(local_408._0_8_ + pcVar14 * 8));
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_560,(double *)local_490);
  local_4c0._1_1_ = bVar10;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_4b8 = (double *)local_490;
  local_4b0._M_allocated_capacity = (size_type)(WithinRelMatcher *)local_560;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x260;
  capturedExpression_49.m_size = 0x26;
  capturedExpression_49.m_start = "6., WithinRel( subsection1.F()[0][1] )";
  macroName_49.m_size = 10;
  macroName_49.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_49,(SourceLineInfo *)local_560,
             capturedExpression_49,ContinueOnFailure);
  local_460 = (undefined1  [8])0x4018000000000000;
  pcVar16 = (char *)(CONCAT44(local_408._12_4_,local_408._8_4_) - local_408._0_8_ >> 3);
  if ((char *)(local_438._16_8_ + 2) < pcVar16) {
    pcVar16 = (char *)(local_438._16_8_ + 2);
  }
  pcVar14 = (char *)0x3;
  if ((long)pcVar16 < 3) {
    pcVar14 = pcVar16;
  }
  local_4b8 = (double *)(local_408._0_8_ + pcVar14 * 8);
  lVar17 = (long)pcVar16 * 8 + (long)pcVar14 * -8;
  local_4c0 = (pointer)(local_408._0_8_ + pcVar16 * 8);
  local_4b0._M_allocated_capacity = 2;
  lVar11 = lVar17 >> 3;
  lVar11 = lVar11 - (lVar11 - (lVar17 >> 0x3f) & 0xfffffffffffffffeU);
  local_4b0._8_8_ = 2 - lVar11;
  if (lVar11 == 0) {
    local_4b0._8_8_ = 0;
  }
  local_318 = local_4c8;
  local_320._M_current = local_4b8;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_318,&local_320,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_560,*local_320._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_560,(double *)local_460);
  local_488._1_1_ = bVar10;
  local_488._0_1_ = true;
  local_490 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_480._M_current = (double *)local_460;
  local_478 = (WithinRelMatcher *)local_560;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_490);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_490);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x261;
  capturedExpression_50.m_size = 0x27;
  capturedExpression_50.m_start = "10., WithinRel( subsection1.F()[1][0] )";
  macroName_50.m_size = 10;
  macroName_50.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_50,(SourceLineInfo *)local_560,
             capturedExpression_50,ContinueOnFailure);
  local_3d8._vptr_ITransientExpression = (_func_int **)0x4024000000000000;
  local_4b0._M_allocated_capacity = local_438._16_8_ + 2;
  local_4b8 = (double *)local_408;
  local_4b0._8_8_ = 0x300000000;
  local_4a0 = 4.24399158193054e-314;
  local_f8 = (double *)local_408._0_8_;
  local_f0 = 0;
  local_e8 = (char *)local_4b0._M_allocated_capacity;
  local_d8 = pcVar15;
  ranges::
  basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::adaptor<true>>>,ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>,ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,int>>,ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,int>>>>>::adaptor<false>>>
  ::operator[]<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
              *)local_490,&local_f8,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_560,*local_480._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_560,(double *)&local_3d8);
  local_458._1_1_ = bVar10;
  local_458._0_1_ = true;
  local_460 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_450._M_current = (double *)&local_3d8;
  local_448 = (WithinRelMatcher *)local_560;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_460);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_460);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x262;
  capturedExpression_51.m_size = 0x27;
  capturedExpression_51.m_start = "12., WithinRel( subsection1.F()[1][1] )";
  macroName_51.m_size = 10;
  macroName_51.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_51,(SourceLineInfo *)local_560,
             capturedExpression_51,ContinueOnFailure);
  local_3d8._vptr_ITransientExpression = (_func_int **)0x4028000000000000;
  local_4b0._M_allocated_capacity = local_438._16_8_ + 2;
  local_4b8 = (double *)local_408;
  local_4b0._8_8_ = 0x300000000;
  local_4a0 = 4.24399158193054e-314;
  local_1e8._M_current = (double *)local_408._0_8_;
  local_1e0 = (return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
               *)0x0;
  local_1d8 = (char *)local_4b0._M_allocated_capacity;
  local_1c8 = pcVar15;
  ranges::
  basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::adaptor<true>>>,ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>,ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,int>>,ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,int>>>>>::adaptor<false>>>
  ::operator[]<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
              *)local_490,&local_1e8,1);
  local_1e8._M_current = local_480._M_current;
  local_1e0 = (return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
               *)local_490;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_1e0,&local_1e8,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_560,*local_1e8._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_560,(double *)&local_3d8);
  local_458._1_1_ = bVar10;
  local_458._0_1_ = true;
  local_460 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_450._M_current = (double *)&local_3d8;
  local_448 = (WithinRelMatcher *)local_560;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_460);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_460);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x263;
  capturedExpression_52.m_size = 0x32;
  capturedExpression_52.m_start = "4., WithinRel( subsection1.probabilities()[0][0] )";
  macroName_52.m_size = 10;
  macroName_52.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_52,(SourceLineInfo *)local_560,
             capturedExpression_52,ContinueOnFailure);
  local_490 = (undefined1  [8])0x4010000000000000;
  pcVar16 = (char *)(CONCAT44(local_408._12_4_,local_408._8_4_) - local_408._0_8_ >> 3);
  if ((char *)(local_438._16_8_ + 2) < pcVar16) {
    pcVar16 = (char *)(local_438._16_8_ + 2);
  }
  pcVar14 = (char *)0x3;
  if ((long)pcVar16 < 3) {
    pcVar14 = pcVar16;
  }
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_560,*(double *)(local_408._0_8_ + pcVar14 * 8));
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_560,(double *)local_490);
  local_4c0._1_1_ = bVar10;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_4b8 = (double *)local_490;
  local_4b0._M_allocated_capacity = (size_type)(WithinRelMatcher *)local_560;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x264;
  capturedExpression_53.m_size = 0x32;
  capturedExpression_53.m_start = "6., WithinRel( subsection1.probabilities()[0][1] )";
  macroName_53.m_size = 10;
  macroName_53.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_53,(SourceLineInfo *)local_560,
             capturedExpression_53,ContinueOnFailure);
  local_460 = (undefined1  [8])0x4018000000000000;
  pcVar16 = (char *)(CONCAT44(local_408._12_4_,local_408._8_4_) - local_408._0_8_ >> 3);
  if ((char *)(local_438._16_8_ + 2) < pcVar16) {
    pcVar16 = (char *)(local_438._16_8_ + 2);
  }
  pcVar14 = (char *)0x3;
  if ((long)pcVar16 < 3) {
    pcVar14 = pcVar16;
  }
  local_4b8 = (double *)(local_408._0_8_ + pcVar14 * 8);
  lVar17 = (long)pcVar16 * 8 + (long)pcVar14 * -8;
  local_4c0 = (pointer)(local_408._0_8_ + pcVar16 * 8);
  local_4b0._M_allocated_capacity = 2;
  lVar11 = lVar17 >> 3;
  lVar11 = lVar11 - (lVar11 - (lVar17 >> 0x3f) & 0xfffffffffffffffeU);
  local_4b0._8_8_ = 2 - lVar11;
  if (lVar11 == 0) {
    local_4b0._8_8_ = 0;
  }
  local_308 = local_4c8;
  local_310._M_current = local_4b8;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_308,&local_310,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_560,*local_310._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_560,(double *)local_460);
  local_488._1_1_ = bVar10;
  local_488._0_1_ = true;
  local_490 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_480._M_current = (double *)local_460;
  local_478 = (WithinRelMatcher *)local_560;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_490);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_490);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x265;
  capturedExpression_54.m_size = 0x33;
  capturedExpression_54.m_start = "10., WithinRel( subsection1.probabilities()[1][0] )";
  macroName_54.m_size = 10;
  macroName_54.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_54,(SourceLineInfo *)local_560,
             capturedExpression_54,ContinueOnFailure);
  local_3d8._vptr_ITransientExpression = (_func_int **)0x4024000000000000;
  local_4b0._M_allocated_capacity = local_438._16_8_ + 2;
  local_4b8 = (double *)local_408;
  local_4b0._8_8_ = 0x300000000;
  local_4a0 = 4.24399158193054e-314;
  local_d0 = (double *)local_408._0_8_;
  local_c8 = 0;
  local_c0 = (char *)local_4b0._M_allocated_capacity;
  local_b0 = pcVar15;
  ranges::
  basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::adaptor<true>>>,ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>,ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,int>>,ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,int>>>>>::adaptor<false>>>
  ::operator[]<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
              *)local_490,&local_d0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_560,*local_480._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_560,(double *)&local_3d8);
  local_458._1_1_ = bVar10;
  local_458._0_1_ = true;
  local_460 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_450._M_current = (double *)&local_3d8;
  local_448 = (WithinRelMatcher *)local_560;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_460);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_460);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  local_560 = (undefined1  [8])0x1b05a4;
  local_558 = (pointer)0x266;
  capturedExpression_55.m_size = 0x33;
  capturedExpression_55.m_start = "12., WithinRel( subsection1.probabilities()[1][1] )";
  macroName_55.m_size = 10;
  macroName_55.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_518,macroName_55,(SourceLineInfo *)local_560,
             capturedExpression_55,ContinueOnFailure);
  local_3d8._vptr_ITransientExpression = (_func_int **)0x4028000000000000;
  local_4b0._M_allocated_capacity = local_438._16_8_ + 2;
  local_4b8 = (double *)local_408;
  local_4b0._8_8_ = 0x300000000;
  local_4a0 = 4.24399158193054e-314;
  local_1c0._M_current = (double *)local_408._0_8_;
  local_1b8 = (undefined1 *)0x0;
  local_1b0 = (char *)local_4b0._M_allocated_capacity;
  local_1a0 = pcVar15;
  ranges::
  basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::adaptor<true>>>,ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>,ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,int>>,ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,int>>>>>::adaptor<false>>>
  ::operator[]<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
              *)local_490,&local_1c0,1);
  local_1c0._M_current = local_480._M_current;
  local_1b8 = local_490;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_1b8,&local_1c0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_560,*local_1c0._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_560,(double *)&local_3d8);
  local_458._1_1_ = bVar10;
  local_458._0_1_ = true;
  local_460 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_450._M_current = (double *)&local_3d8;
  local_448 = (WithinRelMatcher *)local_560;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_518,(ITransientExpression *)local_460);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_460);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_560);
  Catch::AssertionHandler::complete((AssertionHandler *)local_518);
  if (local_4e8[0xb] == false) {
    (*local_4d8->_vptr_IResultCapture[0x13])();
  }
  pvVar12 = std::
            get<3ul,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>
                      ((local_3e0->sequence_).
                       super__Vector_base<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
  local_518 = *(undefined1 (*) [8])
               &(pvVar12->super_Base).super_ListRecord.metadata.fields.
                super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                super__Tuple_impl<2UL,_long,_long,_long,_long>;
  uStack_510 = (pvVar12->super_Base).super_ListRecord.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
               super__Head_base<4UL,_long,_false>._M_head_impl;
  local_508 = (char *)(pvVar12->super_Base).super_ListRecord.metadata.fields.
                      super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                      super__Tuple_impl<2UL,_long,_long,_long,_long>.
                      super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
                      _M_head_impl;
  sStack_500 = (pvVar12->super_Base).super_ListRecord.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
               _M_head_impl;
  local_4f8 = (char *)(pvVar12->super_Base).super_ListRecord.metadata.fields.
                      super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                      super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                      super__Head_base<1UL,_double,_false>._M_head_impl;
  dStack_4f0 = (pvVar12->super_Base).super_ListRecord.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Head_base<0UL,_double,_false>._M_head_impl;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_4e8,
             &(pvVar12->super_Base).super_ListRecord.data);
  local_4d0 = pvVar12->lang_;
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x269;
  capturedExpression_56.m_size = 0x22;
  capturedExpression_56.m_start = "2e+7, WithinRel( subsection2.E() )";
  macroName_56.m_size = 10;
  macroName_56.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_56,(SourceLineInfo *)local_4c8,
             capturedExpression_56,ContinueOnFailure);
  local_460 = (undefined1  [8])0x417312d000000000;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_4c8,(double)local_4f8);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_4c8,(double *)local_460);
  local_488._1_1_ = bVar10;
  local_488._0_1_ = true;
  local_490 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_480._M_current = (double *)local_460;
  local_478 = (WithinRelMatcher *)local_4c8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_490);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_490);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x26a;
  capturedExpression_57.m_size = 0x2f;
  capturedExpression_57.m_start = "2e+7, WithinRel( subsection2.incidentEnergy() )";
  macroName_57.m_size = 10;
  macroName_57.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_57,(SourceLineInfo *)local_4c8,
             capturedExpression_57,ContinueOnFailure);
  local_460 = (undefined1  [8])0x417312d000000000;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_4c8,(double)local_4f8);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_4c8,(double *)local_460);
  local_488._1_1_ = bVar10;
  local_488._0_1_ = true;
  local_490 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_480._M_current = (double *)local_460;
  local_478 = (WithinRelMatcher *)local_4c8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_490);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_490);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x26b;
  capturedExpression_58.m_size = 0x18;
  capturedExpression_58.m_start = "14 == subsection2.LANG()";
  macroName_58.m_size = 5;
  macroName_58.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_58,(SourceLineInfo *)local_4c8,
             capturedExpression_58,ContinueOnFailure);
  local_4c0._1_1_ = local_4d0 == 0xe;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f51e8;
  local_4c0._4_4_ = 0xe;
  local_4b8 = (double *)0x1b3ad1;
  local_4b0._M_allocated_capacity = 2;
  local_4b0._8_4_ = local_4d0;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x26c;
  capturedExpression_59.m_size = 0x15;
  capturedExpression_59.m_start = "0 == subsection2.ND()";
  macroName_59.m_size = 5;
  macroName_59.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_59,(SourceLineInfo *)local_4c8,
             capturedExpression_59,ContinueOnFailure);
  local_4c0._1_1_ = sStack_500 == 0;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5228;
  local_4c0 = local_4c0 & 0xffffffff;
  local_4b8 = (double *)0x1b3ad1;
  local_4b0._M_allocated_capacity = 2;
  local_4b0._8_8_ = sStack_500;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x26d;
  capturedExpression_60.m_size = 0x29;
  capturedExpression_60.m_start = "0 == subsection2.numberDiscreteEnergies()";
  macroName_60.m_size = 5;
  macroName_60.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_60,(SourceLineInfo *)local_4c8,
             capturedExpression_60,ContinueOnFailure);
  local_4c0._1_1_ = sStack_500 == 0;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5228;
  local_4c0 = local_4c0 & 0xffffffff;
  local_4b8 = (double *)0x1b3ad1;
  local_4b0._M_allocated_capacity = 2;
  local_4b0._8_8_ = sStack_500;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x26e;
  capturedExpression_61.m_size = 0x15;
  capturedExpression_61.m_start = "4 == subsection2.NA()";
  macroName_61.m_size = 5;
  macroName_61.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_61,(SourceLineInfo *)local_4c8,
             capturedExpression_61,ContinueOnFailure);
  local_4c0._1_1_ = local_508 == (char *)0x4;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5228;
  local_4c0._4_4_ = 4;
  local_4b8 = (double *)0x1b3ad1;
  local_4b0._M_allocated_capacity = 2;
  local_4b0._8_8_ = local_508;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x26f;
  capturedExpression_62.m_size = 0x2a;
  capturedExpression_62.m_start = "4 == subsection2.numberAngularParameters()";
  macroName_62.m_size = 5;
  macroName_62.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_62,(SourceLineInfo *)local_4c8,
             capturedExpression_62,ContinueOnFailure);
  local_4c0._1_1_ = local_508 == (char *)0x4;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5228;
  local_4c0._4_4_ = 4;
  local_4b8 = (double *)0x1b3ad1;
  local_4b0._M_allocated_capacity = 2;
  local_4b0._8_8_ = local_508;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x270;
  capturedExpression_63.m_size = 0x16;
  capturedExpression_63.m_start = "12 == subsection2.NW()";
  macroName_63.m_size = 5;
  macroName_63.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_63,(SourceLineInfo *)local_4c8,
             capturedExpression_63,ContinueOnFailure);
  lVar11 = CONCAT44(local_4e8._12_4_,local_4e8._8_4_) - local_4e8._0_8_;
  local_4b0._8_8_ = lVar11 >> 3;
  local_4c0._1_1_ = lVar11 == 0x60;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5228;
  local_4c0._4_4_ = 0xc;
  local_4b8 = (double *)0x1b3ad1;
  local_4b0._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x271;
  capturedExpression_64.m_size = 0x16;
  capturedExpression_64.m_start = "2 == subsection2.NEP()";
  macroName_64.m_size = 5;
  macroName_64.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_64,(SourceLineInfo *)local_4c8,
             capturedExpression_64,ContinueOnFailure);
  local_4c0._1_1_ = local_518 == (undefined1  [8])0x2;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5228;
  local_4c0._4_4_ = 2;
  local_4b8 = (double *)0x1b3ad1;
  local_4b0._M_allocated_capacity = 2;
  local_4b0._8_8_ = local_518;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x272;
  capturedExpression_65.m_size = 0x2a;
  capturedExpression_65.m_start = "2 == subsection2.numberSecondaryEnergies()";
  macroName_65.m_size = 5;
  macroName_65.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_65,(SourceLineInfo *)local_4c8,
             capturedExpression_65,ContinueOnFailure);
  local_4c0._1_1_ = local_518 == (undefined1  [8])0x2;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5228;
  local_4c0._4_4_ = 2;
  local_4b8 = (double *)0x1b3ad1;
  local_4b0._M_allocated_capacity = 2;
  local_4b0._8_8_ = local_518;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x273;
  capturedExpression_66.m_size = 0x1c;
  capturedExpression_66.m_start = "2 == subsection2.EP().size()";
  macroName_66.m_size = 5;
  macroName_66.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_66,(SourceLineInfo *)local_4c8,
             capturedExpression_66,ContinueOnFailure);
  local_4b0._8_8_ =
       (ulong)(local_508 + (CONCAT44(local_4e8._12_4_,local_4e8._8_4_) - local_4e8._0_8_ >> 3) + 1)
       / (ulong)(local_508 + 2);
  local_4c0._1_1_ = local_4b0._8_8_ == 2;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5268;
  local_4c0._4_4_ = 2;
  local_4b8 = (double *)0x1b3ad1;
  local_4b0._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x274;
  capturedExpression_67.m_size = 0x22;
  capturedExpression_67.m_start = "2 == subsection2.energies().size()";
  macroName_67.m_size = 5;
  macroName_67.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_67,(SourceLineInfo *)local_4c8,
             capturedExpression_67,ContinueOnFailure);
  local_4b0._8_8_ =
       (ulong)(local_508 + (CONCAT44(local_4e8._12_4_,local_4e8._8_4_) - local_4e8._0_8_ >> 3) + 1)
       / (ulong)(local_508 + 2);
  local_4c0._1_1_ = local_4b0._8_8_ == 2;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5268;
  local_4c0._4_4_ = 2;
  local_4b8 = (double *)0x1b3ad1;
  local_4b0._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x275;
  capturedExpression_68.m_size = 0x25;
  capturedExpression_68.m_start = "13., WithinRel( subsection2.EP()[0] )";
  macroName_68.m_size = 10;
  macroName_68.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_68,(SourceLineInfo *)local_4c8,
             capturedExpression_68,ContinueOnFailure);
  local_460 = (undefined1  [8])0x402a000000000000;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_4c8,(double)*(_func_int **)local_4e8._0_8_);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_4c8,(double *)local_460);
  local_488._1_1_ = bVar10;
  local_488._0_1_ = true;
  local_490 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_480._M_current = (double *)local_460;
  local_478 = (WithinRelMatcher *)local_4c8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_490);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_490);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x276;
  capturedExpression_69.m_size = 0x25;
  capturedExpression_69.m_start = "19., WithinRel( subsection2.EP()[1] )";
  macroName_69.m_size = 10;
  macroName_69.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_69,(SourceLineInfo *)local_4c8,
             capturedExpression_69,ContinueOnFailure);
  local_3d8._vptr_ITransientExpression = (_func_int **)0x4033000000000000;
  local_450._M_current = (double *)(local_508 + 2);
  local_458 = (double *)local_4e8;
  lVar11 = CONCAT44(local_4e8._12_4_,local_4e8._8_4_) - local_4e8._0_8_;
  auVar6._8_8_ = lVar11 >> 0x3f;
  auVar6._0_8_ = lVar11 >> 3;
  lVar11 = SUB168(auVar6 % SEXT816((long)local_450._M_current),0);
  local_448 = (WithinRelMatcher *)((long)local_450._M_current - lVar11);
  if (lVar11 == 0) {
    local_448 = (WithinRelMatcher *)0x0;
  }
  local_300._M_current = (double *)local_4e8._0_8_;
  local_2f8 = local_460;
  ranges::stride_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>::
  adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_2f8,&local_300,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_4c8,(double)*local_300._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_4c8,(double *)&local_3d8);
  local_488._1_1_ = bVar10;
  local_488._0_1_ = true;
  local_490 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_480._M_current = (double *)&local_3d8;
  local_478 = (WithinRelMatcher *)local_4c8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_490);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_490);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x277;
  capturedExpression_70.m_size = 0x2b;
  capturedExpression_70.m_start = "13., WithinRel( subsection2.energies()[0] )";
  macroName_70.m_size = 10;
  macroName_70.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_70,(SourceLineInfo *)local_4c8,
             capturedExpression_70,ContinueOnFailure);
  local_460 = (undefined1  [8])0x402a000000000000;
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_4c8,(double)*(_func_int **)local_4e8._0_8_);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_4c8,(double *)local_460);
  local_488._1_1_ = bVar10;
  local_488._0_1_ = true;
  local_490 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_480._M_current = (double *)local_460;
  local_478 = (WithinRelMatcher *)local_4c8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_490);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_490);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x278;
  capturedExpression_71.m_size = 0x2b;
  capturedExpression_71.m_start = "19., WithinRel( subsection2.energies()[1] )";
  macroName_71.m_size = 10;
  macroName_71.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_71,(SourceLineInfo *)local_4c8,
             capturedExpression_71,ContinueOnFailure);
  local_3d8._vptr_ITransientExpression = (_func_int **)0x4033000000000000;
  local_450._M_current = (double *)(local_508 + 2);
  local_458 = (double *)local_4e8;
  lVar11 = CONCAT44(local_4e8._12_4_,local_4e8._8_4_) - local_4e8._0_8_;
  auVar7._8_8_ = lVar11 >> 0x3f;
  auVar7._0_8_ = lVar11 >> 3;
  lVar11 = SUB168(auVar7 % SEXT816((long)local_450._M_current),0);
  local_448 = (WithinRelMatcher *)((long)local_450._M_current - lVar11);
  if (lVar11 == 0) {
    local_448 = (WithinRelMatcher *)0x0;
  }
  local_2f0._M_current = (double *)local_4e8._0_8_;
  local_2e8 = local_460;
  ranges::stride_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>::
  adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_2e8,&local_2f0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_4c8,(double)*local_2f0._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_4c8,(double *)&local_3d8);
  local_488._1_1_ = bVar10;
  local_488._0_1_ = true;
  local_490 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_480._M_current = (double *)&local_3d8;
  local_478 = (WithinRelMatcher *)local_4c8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_490);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_490);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x279;
  capturedExpression_72.m_size = 0x1c;
  capturedExpression_72.m_start = "2 == subsection2.F0().size()";
  macroName_72.m_size = 5;
  macroName_72.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_72,(SourceLineInfo *)local_4c8,
             capturedExpression_72,ContinueOnFailure);
  local_4b0._8_8_ =
       (ulong)(local_508 +
              ((CONCAT44(local_4e8._12_4_,local_4e8._8_4_) - local_4e8._0_8_) + -8 >> 3) + 1) /
       (ulong)(local_508 + 2);
  local_4c0._1_1_ = local_4b0._8_8_ == 2;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5268;
  local_4c0._4_4_ = 2;
  local_4b8 = (double *)0x1b3ad1;
  local_4b0._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x27a;
  capturedExpression_73.m_size = 0x34;
  capturedExpression_73.m_start = "2 == subsection2.totalEmissionProbabilities().size()";
  macroName_73.m_size = 5;
  macroName_73.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_73,(SourceLineInfo *)local_4c8,
             capturedExpression_73,ContinueOnFailure);
  local_4b0._8_8_ =
       (ulong)(local_508 +
              ((CONCAT44(local_4e8._12_4_,local_4e8._8_4_) - local_4e8._0_8_) + -8 >> 3) + 1) /
       (ulong)(local_508 + 2);
  local_4c0._1_1_ = local_4b0._8_8_ == 2;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5268;
  local_4c0._4_4_ = 2;
  local_4b8 = (double *)0x1b3ad1;
  local_4b0._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x27b;
  capturedExpression_74.m_size = 0x25;
  capturedExpression_74.m_start = "14., WithinRel( subsection2.F0()[0] )";
  macroName_74.m_size = 10;
  macroName_74.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_74,(SourceLineInfo *)local_4c8,
             capturedExpression_74,ContinueOnFailure);
  local_460 = (undefined1  [8])0x402c000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_4c8,(double)*(_func_int **)(local_4e8._0_8_ + 8));
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_4c8,(double *)local_460);
  local_488._1_1_ = bVar10;
  local_488._0_1_ = true;
  local_490 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_480._M_current = (double *)local_460;
  local_478 = (WithinRelMatcher *)local_4c8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_490);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_490);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x27c;
  capturedExpression_75.m_size = 0x25;
  capturedExpression_75.m_start = "20., WithinRel( subsection2.F0()[1] )";
  macroName_75.m_size = 10;
  macroName_75.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_75,(SourceLineInfo *)local_4c8,
             capturedExpression_75,ContinueOnFailure);
  local_3d8._vptr_ITransientExpression = (_func_int **)0x4034000000000000;
  local_480._M_current = (double *)(local_4e8._0_8_ + 8);
  local_488 = (double *)CONCAT44(local_4e8._12_4_,local_4e8._8_4_);
  local_478 = (WithinRelMatcher *)(local_508 + 2);
  auVar8._8_8_ = (long)local_488 - (long)local_480._M_current >> 0x3f;
  auVar8._0_8_ = (long)local_488 - (long)local_480._M_current >> 3;
  lVar11 = SUB168(auVar8 % SEXT816((long)local_478),0);
  local_470[0] = (long)local_478 - lVar11;
  if (lVar11 == 0) {
    local_470[0] = 0;
  }
  local_2d8 = local_490;
  local_2e0._M_current = local_480._M_current;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_2d8,&local_2e0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_4c8,*local_2e0._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_4c8,(double *)&local_3d8);
  local_458._1_1_ = bVar10;
  local_458._0_1_ = true;
  local_460 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_450._M_current = (double *)&local_3d8;
  local_448 = (WithinRelMatcher *)local_4c8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_460);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_460);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x27d;
  capturedExpression_76.m_size = 0x3d;
  capturedExpression_76.m_start = "14., WithinRel( subsection2.totalEmissionProbabilities()[0] )";
  macroName_76.m_size = 10;
  macroName_76.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_76,(SourceLineInfo *)local_4c8,
             capturedExpression_76,ContinueOnFailure);
  local_460 = (undefined1  [8])0x402c000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_4c8,(double)*(_func_int **)(local_4e8._0_8_ + 8));
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_4c8,(double *)local_460);
  local_488._1_1_ = bVar10;
  local_488._0_1_ = true;
  local_490 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_480._M_current = (double *)local_460;
  local_478 = (WithinRelMatcher *)local_4c8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_490);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_490);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x27e;
  capturedExpression_77.m_size = 0x3d;
  capturedExpression_77.m_start = "20., WithinRel( subsection2.totalEmissionProbabilities()[1] )";
  macroName_77.m_size = 10;
  macroName_77.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_77,(SourceLineInfo *)local_4c8,
             capturedExpression_77,ContinueOnFailure);
  local_3d8._vptr_ITransientExpression = (_func_int **)0x4034000000000000;
  local_480._M_current = (double *)(local_4e8._0_8_ + 8);
  local_488 = (double *)CONCAT44(local_4e8._12_4_,local_4e8._8_4_);
  local_478 = (WithinRelMatcher *)(local_508 + 2);
  auVar9._8_8_ = (long)local_488 - (long)local_480._M_current >> 0x3f;
  auVar9._0_8_ = (long)local_488 - (long)local_480._M_current >> 3;
  lVar11 = SUB168(auVar9 % SEXT816((long)local_478),0);
  local_470[0] = (long)local_478 - lVar11;
  if (lVar11 == 0) {
    local_470[0] = 0;
  }
  local_2c8 = local_490;
  local_2d0._M_current = local_480._M_current;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_2c8,&local_2d0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_4c8,*local_2d0._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_4c8,(double *)&local_3d8);
  local_458._1_1_ = bVar10;
  local_458._0_1_ = true;
  local_460 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_450._M_current = (double *)&local_3d8;
  local_448 = (WithinRelMatcher *)local_4c8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_460);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_460);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x27f;
  capturedExpression_78.m_size = 0x1c;
  capturedExpression_78.m_start = "2 == subsection2.MU().size()";
  macroName_78.m_size = 5;
  macroName_78.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_78,(SourceLineInfo *)local_4c8,
             capturedExpression_78,ContinueOnFailure);
  uVar13 = CONCAT44(local_4e8._12_4_,local_4e8._8_4_) - local_4e8._0_8_ >> 3;
  local_4b0._8_8_ =
       (uVar13 / (ulong)(local_508 + 2) + 1) - (ulong)(uVar13 % (ulong)(local_508 + 2) == 0);
  local_4c0._1_1_ = local_4b0._8_8_ == 2;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5268;
  local_4c0._4_4_ = 2;
  local_4b8 = (double *)0x1b3ad1;
  local_4b0._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x280;
  capturedExpression_79.m_size = 0x21;
  capturedExpression_79.m_start = "2 == subsection2.cosines().size()";
  macroName_79.m_size = 5;
  macroName_79.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_79,(SourceLineInfo *)local_4c8,
             capturedExpression_79,ContinueOnFailure);
  uVar13 = CONCAT44(local_4e8._12_4_,local_4e8._8_4_) - local_4e8._0_8_ >> 3;
  local_4b0._8_8_ =
       (uVar13 / (ulong)(local_508 + 2) + 1) - (ulong)(uVar13 % (ulong)(local_508 + 2) == 0);
  local_4c0._1_1_ = local_4b0._8_8_ == 2;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5268;
  local_4c0._4_4_ = 2;
  local_4b8 = (double *)0x1b3ad1;
  local_4b0._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x281;
  capturedExpression_80.m_size = 0x28;
  capturedExpression_80.m_start = "15., WithinRel( subsection2.MU()[0][0] )";
  macroName_80.m_size = 10;
  macroName_80.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_80,(SourceLineInfo *)local_4c8,
             capturedExpression_80,ContinueOnFailure);
  local_460 = (undefined1  [8])0x402e000000000000;
  pcVar15 = (char *)(CONCAT44(local_4e8._12_4_,local_4e8._8_4_) - local_4e8._0_8_ >> 3);
  if (local_508 + 2 < pcVar15) {
    pcVar15 = local_508 + 2;
  }
  pcVar16 = (char *)0x2;
  if ((long)pcVar15 < 2) {
    pcVar16 = pcVar15;
  }
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_4c8,(double)*(_func_int **)(local_4e8._0_8_ + pcVar16 * 8));
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_4c8,(double *)local_460);
  local_488._1_1_ = bVar10;
  local_488._0_1_ = true;
  local_490 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_480._M_current = (double *)local_460;
  local_478 = (WithinRelMatcher *)local_4c8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_490);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_490);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x282;
  capturedExpression_81.m_size = 0x28;
  capturedExpression_81.m_start = "17., WithinRel( subsection2.MU()[0][1] )";
  macroName_81.m_size = 10;
  macroName_81.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_81,(SourceLineInfo *)local_4c8,
             capturedExpression_81,ContinueOnFailure);
  local_3d8._vptr_ITransientExpression = (_func_int **)0x4031000000000000;
  pcVar15 = (char *)(CONCAT44(local_4e8._12_4_,local_4e8._8_4_) - local_4e8._0_8_ >> 3);
  if (local_508 + 2 < pcVar15) {
    pcVar15 = local_508 + 2;
  }
  pcVar16 = (char *)0x2;
  if ((long)pcVar15 < 2) {
    pcVar16 = pcVar15;
  }
  local_480._M_current = (double *)(local_4e8._0_8_ + pcVar16 * 8);
  lVar17 = (long)pcVar15 * 8 + (long)pcVar16 * -8;
  local_488 = (double *)(local_4e8._0_8_ + pcVar15 * 8);
  local_478 = (WithinRelMatcher *)0x2;
  lVar11 = lVar17 >> 3;
  lVar11 = lVar11 - (lVar11 - (lVar17 >> 0x3f) & 0xfffffffffffffffeU);
  local_470[0] = 2 - lVar11;
  if (lVar11 == 0) {
    local_470[0] = 0;
  }
  local_2b8 = local_490;
  local_2c0._M_current = local_480._M_current;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_2b8,&local_2c0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_4c8,*local_2c0._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_4c8,(double *)&local_3d8);
  local_458._1_1_ = bVar10;
  local_458._0_1_ = true;
  local_460 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_450._M_current = (double *)&local_3d8;
  local_448 = (WithinRelMatcher *)local_4c8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_460);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_460);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x283;
  capturedExpression_82.m_size = 0x28;
  capturedExpression_82.m_start = "21., WithinRel( subsection2.MU()[1][0] )";
  macroName_82.m_size = 10;
  macroName_82.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_82,(SourceLineInfo *)local_4c8,
             capturedExpression_82,ContinueOnFailure);
  local_3b0._M_current = (double *)0x4035000000000000;
  local_478 = (WithinRelMatcher *)(local_508 + 2);
  local_480._M_current = (double *)local_4e8;
  local_470[0] = 0x200000000;
  local_470[1] = 0x200000000;
  local_a8 = (_func_int **)local_4e8._0_8_;
  local_a0 = 0;
  local_98 = (char *)local_478;
  local_88 = local_470;
  ranges::
  basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::adaptor<true>>>,ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>,ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,int>>,ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,int>>>>>::adaptor<false>>>
  ::operator[]<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
              *)local_460,&local_a8,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_4c8,*local_450._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_4c8,(double *)&local_3b0);
  local_3d8.m_result = bVar10;
  local_3d8.m_isBinaryExpression = true;
  local_3d8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f52a8;
  local_3c8 = &local_3b0;
  local_3c0 = (WithinRelMatcher *)local_4c8;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_560,&local_3d8);
  Catch::ITransientExpression::~ITransientExpression(&local_3d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x284;
  capturedExpression_83.m_size = 0x28;
  capturedExpression_83.m_start = "23., WithinRel( subsection2.MU()[1][1] )";
  macroName_83.m_size = 10;
  macroName_83.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_83,(SourceLineInfo *)local_4c8,
             capturedExpression_83,ContinueOnFailure);
  local_3b0._M_current = (double *)0x4037000000000000;
  local_478 = (WithinRelMatcher *)(local_508 + 2);
  local_480._M_current = (double *)local_4e8;
  local_470[0] = 0x200000000;
  local_470[1] = 0x200000000;
  local_198._M_current = (double *)local_4e8._0_8_;
  local_190 = (return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
               *)0x0;
  local_188 = (char *)local_478;
  local_178 = local_470;
  ranges::
  basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::adaptor<true>>>,ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>,ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,int>>,ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,int>>>>>::adaptor<false>>>
  ::operator[]<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
              *)local_460,&local_198,1);
  local_198._M_current = local_450._M_current;
  local_190 = (return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
               *)local_460;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_190,&local_198,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_4c8,*local_198._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_4c8,(double *)&local_3b0);
  local_3d8.m_result = bVar10;
  local_3d8.m_isBinaryExpression = true;
  local_3d8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f52a8;
  local_3c8 = &local_3b0;
  local_3c0 = (WithinRelMatcher *)local_4c8;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_560,&local_3d8);
  Catch::ITransientExpression::~ITransientExpression(&local_3d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x285;
  capturedExpression_84.m_size = 0x2d;
  capturedExpression_84.m_start = "15., WithinRel( subsection2.cosines()[0][0] )";
  macroName_84.m_size = 10;
  macroName_84.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_84,(SourceLineInfo *)local_4c8,
             capturedExpression_84,ContinueOnFailure);
  local_460 = (undefined1  [8])0x402e000000000000;
  pcVar15 = (char *)(CONCAT44(local_4e8._12_4_,local_4e8._8_4_) - local_4e8._0_8_ >> 3);
  if (local_508 + 2 < pcVar15) {
    pcVar15 = local_508 + 2;
  }
  pcVar16 = (char *)0x2;
  if ((long)pcVar15 < 2) {
    pcVar16 = pcVar15;
  }
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_4c8,(double)*(_func_int **)(local_4e8._0_8_ + pcVar16 * 8));
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_4c8,(double *)local_460);
  local_488._1_1_ = bVar10;
  local_488._0_1_ = true;
  local_490 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_480._M_current = (double *)local_460;
  local_478 = (WithinRelMatcher *)local_4c8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_490);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_490);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x286;
  capturedExpression_85.m_size = 0x2d;
  capturedExpression_85.m_start = "17., WithinRel( subsection2.cosines()[0][1] )";
  macroName_85.m_size = 10;
  macroName_85.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_85,(SourceLineInfo *)local_4c8,
             capturedExpression_85,ContinueOnFailure);
  local_3d8._vptr_ITransientExpression = (_func_int **)0x4031000000000000;
  pcVar15 = (char *)(CONCAT44(local_4e8._12_4_,local_4e8._8_4_) - local_4e8._0_8_ >> 3);
  if (local_508 + 2 < pcVar15) {
    pcVar15 = local_508 + 2;
  }
  pcVar16 = (char *)0x2;
  if ((long)pcVar15 < 2) {
    pcVar16 = pcVar15;
  }
  local_480._M_current = (double *)(local_4e8._0_8_ + pcVar16 * 8);
  lVar17 = (long)pcVar15 * 8 + (long)pcVar16 * -8;
  local_488 = (double *)(local_4e8._0_8_ + pcVar15 * 8);
  local_478 = (WithinRelMatcher *)0x2;
  lVar11 = lVar17 >> 3;
  lVar11 = lVar11 - (lVar11 - (lVar17 >> 0x3f) & 0xfffffffffffffffeU);
  local_470[0] = 2 - lVar11;
  if (lVar11 == 0) {
    local_470[0] = 0;
  }
  local_2a8 = local_490;
  local_2b0._M_current = local_480._M_current;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_2a8,&local_2b0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_4c8,*local_2b0._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_4c8,(double *)&local_3d8);
  local_458._1_1_ = bVar10;
  local_458._0_1_ = true;
  local_460 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_450._M_current = (double *)&local_3d8;
  local_448 = (WithinRelMatcher *)local_4c8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_460);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_460);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x287;
  capturedExpression_86.m_size = 0x2d;
  capturedExpression_86.m_start = "21., WithinRel( subsection2.cosines()[1][0] )";
  macroName_86.m_size = 10;
  macroName_86.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_86,(SourceLineInfo *)local_4c8,
             capturedExpression_86,ContinueOnFailure);
  local_3b0._M_current = (double *)0x4035000000000000;
  local_478 = (WithinRelMatcher *)(local_508 + 2);
  local_480._M_current = (double *)local_4e8;
  local_470[0] = 0x200000000;
  local_470[1] = 0x200000000;
  local_80 = (_func_int **)local_4e8._0_8_;
  local_78 = 0;
  local_70 = (char *)local_478;
  local_60 = local_470;
  ranges::
  basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::adaptor<true>>>,ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>,ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,int>>,ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,int>>>>>::adaptor<false>>>
  ::operator[]<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
              *)local_460,&local_80,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_4c8,*local_450._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_4c8,(double *)&local_3b0);
  local_3d8.m_result = bVar10;
  local_3d8.m_isBinaryExpression = true;
  local_3d8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f52a8;
  local_3c8 = &local_3b0;
  local_3c0 = (WithinRelMatcher *)local_4c8;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_560,&local_3d8);
  Catch::ITransientExpression::~ITransientExpression(&local_3d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x288;
  capturedExpression_87.m_size = 0x2d;
  capturedExpression_87.m_start = "23., WithinRel( subsection2.cosines()[1][1] )";
  macroName_87.m_size = 10;
  macroName_87.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_87,(SourceLineInfo *)local_4c8,
             capturedExpression_87,ContinueOnFailure);
  local_3b0._M_current = (double *)0x4037000000000000;
  local_478 = (WithinRelMatcher *)(local_508 + 2);
  local_480._M_current = (double *)local_4e8;
  local_470[0] = 0x200000000;
  local_470[1] = 0x200000000;
  local_170._M_current = (double *)local_4e8._0_8_;
  local_168 = (return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
               *)0x0;
  local_160 = (char *)local_478;
  local_150 = local_470;
  ranges::
  basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::adaptor<true>>>,ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>,ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,int>>,ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,int>>>>>::adaptor<false>>>
  ::operator[]<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
              *)local_460,&local_170,1);
  local_170._M_current = local_450._M_current;
  local_168 = (return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
               *)local_460;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_168,&local_170,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_4c8,*local_170._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_4c8,(double *)&local_3b0);
  local_3d8.m_result = bVar10;
  local_3d8.m_isBinaryExpression = true;
  local_3d8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f52a8;
  local_3c8 = &local_3b0;
  local_3c0 = (WithinRelMatcher *)local_4c8;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_560,&local_3d8);
  Catch::ITransientExpression::~ITransientExpression(&local_3d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x289;
  capturedExpression_88.m_size = 0x1b;
  capturedExpression_88.m_start = "2 == subsection2.F().size()";
  macroName_88.m_size = 5;
  macroName_88.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_88,(SourceLineInfo *)local_4c8,
             capturedExpression_88,ContinueOnFailure);
  uVar13 = CONCAT44(local_4e8._12_4_,local_4e8._8_4_) - local_4e8._0_8_ >> 3;
  local_4b0._8_8_ =
       (uVar13 / (ulong)(local_508 + 2) + 1) - (ulong)(uVar13 % (ulong)(local_508 + 2) == 0);
  local_4c0._1_1_ = local_4b0._8_8_ == 2;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5268;
  local_4c0._4_4_ = 2;
  local_4b8 = (double *)0x1b3ad1;
  local_4b0._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x28a;
  capturedExpression_89.m_size = 0x27;
  capturedExpression_89.m_start = "2 == subsection2.probabilities().size()";
  macroName_89.m_size = 5;
  macroName_89.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_89,(SourceLineInfo *)local_4c8,
             capturedExpression_89,ContinueOnFailure);
  uVar13 = CONCAT44(local_4e8._12_4_,local_4e8._8_4_) - local_4e8._0_8_ >> 3;
  local_4b0._8_8_ =
       (uVar13 / (ulong)(local_508 + 2) + 1) - (ulong)(uVar13 % (ulong)(local_508 + 2) == 0);
  local_4c0._1_1_ = local_4b0._8_8_ == 2;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5268;
  local_4c0._4_4_ = 2;
  local_4b8 = (double *)0x1b3ad1;
  local_4b0._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x28b;
  capturedExpression_90.m_size = 0x27;
  capturedExpression_90.m_start = "16., WithinRel( subsection2.F()[0][0] )";
  macroName_90.m_size = 10;
  macroName_90.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_90,(SourceLineInfo *)local_4c8,
             capturedExpression_90,ContinueOnFailure);
  local_460 = (undefined1  [8])0x4030000000000000;
  pcVar15 = (char *)(CONCAT44(local_4e8._12_4_,local_4e8._8_4_) - local_4e8._0_8_ >> 3);
  if (local_508 + 2 < pcVar15) {
    pcVar15 = local_508 + 2;
  }
  pcVar16 = (char *)0x3;
  if ((long)pcVar15 < 3) {
    pcVar16 = pcVar15;
  }
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_4c8,(double)*(_func_int **)(local_4e8._0_8_ + pcVar16 * 8));
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_4c8,(double *)local_460);
  local_488._1_1_ = bVar10;
  local_488._0_1_ = true;
  local_490 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_480._M_current = (double *)local_460;
  local_478 = (WithinRelMatcher *)local_4c8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_490);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_490);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x28c;
  capturedExpression_91.m_size = 0x27;
  capturedExpression_91.m_start = "18., WithinRel( subsection2.F()[0][1] )";
  macroName_91.m_size = 10;
  macroName_91.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_91,(SourceLineInfo *)local_4c8,
             capturedExpression_91,ContinueOnFailure);
  local_3d8._vptr_ITransientExpression = (_func_int **)0x4032000000000000;
  pcVar15 = (char *)(CONCAT44(local_4e8._12_4_,local_4e8._8_4_) - local_4e8._0_8_ >> 3);
  if (local_508 + 2 < pcVar15) {
    pcVar15 = local_508 + 2;
  }
  pcVar16 = (char *)0x3;
  if ((long)pcVar15 < 3) {
    pcVar16 = pcVar15;
  }
  local_480._M_current = (double *)(local_4e8._0_8_ + pcVar16 * 8);
  lVar17 = (long)pcVar15 * 8 + (long)pcVar16 * -8;
  local_488 = (double *)(local_4e8._0_8_ + pcVar15 * 8);
  local_478 = (WithinRelMatcher *)0x2;
  lVar11 = lVar17 >> 3;
  lVar11 = lVar11 - (lVar11 - (lVar17 >> 0x3f) & 0xfffffffffffffffeU);
  local_470[0] = 2 - lVar11;
  if (lVar11 == 0) {
    local_470[0] = 0;
  }
  local_298 = local_490;
  local_2a0._M_current = local_480._M_current;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_298,&local_2a0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_4c8,*local_2a0._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_4c8,(double *)&local_3d8);
  local_458._1_1_ = bVar10;
  local_458._0_1_ = true;
  local_460 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_450._M_current = (double *)&local_3d8;
  local_448 = (WithinRelMatcher *)local_4c8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_460);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_460);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x28d;
  capturedExpression_92.m_size = 0x27;
  capturedExpression_92.m_start = "22., WithinRel( subsection2.F()[1][0] )";
  macroName_92.m_size = 10;
  macroName_92.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_92,(SourceLineInfo *)local_4c8,
             capturedExpression_92,ContinueOnFailure);
  local_3b0._M_current = (double *)0x4036000000000000;
  local_478 = (WithinRelMatcher *)(local_508 + 2);
  local_480._M_current = (double *)local_4e8;
  local_470[0] = 0x300000000;
  local_470[1] = 0x200000000;
  local_58 = (_func_int **)local_4e8._0_8_;
  local_50 = 0;
  local_48 = (char *)local_478;
  local_38 = local_470;
  ranges::
  basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::adaptor<true>>>,ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>,ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,int>>,ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,int>>>>>::adaptor<false>>>
  ::operator[]<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
              *)local_460,&local_58,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_4c8,*local_450._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_4c8,(double *)&local_3b0);
  local_3d8.m_result = bVar10;
  local_3d8.m_isBinaryExpression = true;
  local_3d8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f52a8;
  local_3c8 = &local_3b0;
  local_3c0 = (WithinRelMatcher *)local_4c8;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_560,&local_3d8);
  Catch::ITransientExpression::~ITransientExpression(&local_3d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x28e;
  capturedExpression_93.m_size = 0x27;
  capturedExpression_93.m_start = "24., WithinRel( subsection2.F()[1][1] )";
  macroName_93.m_size = 10;
  macroName_93.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_93,(SourceLineInfo *)local_4c8,
             capturedExpression_93,ContinueOnFailure);
  local_280._0_8_ = (_func_int **)0x4038000000000000;
  local_478 = (WithinRelMatcher *)(local_508 + 2);
  local_480._M_current = (double *)local_4e8;
  local_470[0] = 0x300000000;
  local_470[1] = 0x200000000;
  local_3b0._M_current = (double *)local_4e8._0_8_;
  local_3a8 = (return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
               *)0x0;
  local_3a0 = (char *)local_478;
  local_390 = local_470;
  ranges::
  basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::adaptor<true>>>,ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>,ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,int>>,ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,int>>>>>::adaptor<false>>>
  ::operator[]<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
              *)local_460,&local_3b0,1);
  local_3b0._M_current = local_450._M_current;
  local_3a8 = (return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
               *)local_460;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_3a8,&local_3b0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_4c8,*local_3b0._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_4c8,(double *)local_280);
  local_3d8.m_result = bVar10;
  local_3d8.m_isBinaryExpression = true;
  local_3d8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f52a8;
  local_3c8 = (iterator_t<CRng> *)local_280;
  local_3c0 = (WithinRelMatcher *)local_4c8;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_560,&local_3d8);
  Catch::ITransientExpression::~ITransientExpression(&local_3d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x28f;
  capturedExpression_94.m_size = 0x33;
  capturedExpression_94.m_start = "16., WithinRel( subsection2.probabilities()[0][0] )";
  macroName_94.m_size = 10;
  macroName_94.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_94,(SourceLineInfo *)local_4c8,
             capturedExpression_94,ContinueOnFailure);
  local_460 = (undefined1  [8])0x4030000000000000;
  pcVar15 = (char *)(CONCAT44(local_4e8._12_4_,local_4e8._8_4_) - local_4e8._0_8_ >> 3);
  if (local_508 + 2 < pcVar15) {
    pcVar15 = local_508 + 2;
  }
  pcVar16 = (char *)0x3;
  if ((long)pcVar15 < 3) {
    pcVar16 = pcVar15;
  }
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_4c8,(double)*(_func_int **)(local_4e8._0_8_ + pcVar16 * 8));
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_4c8,(double *)local_460);
  local_488._1_1_ = bVar10;
  local_488._0_1_ = true;
  local_490 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_480._M_current = (double *)local_460;
  local_478 = (WithinRelMatcher *)local_4c8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_490);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_490);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x290;
  capturedExpression_95.m_size = 0x33;
  capturedExpression_95.m_start = "18., WithinRel( subsection2.probabilities()[0][1] )";
  macroName_95.m_size = 10;
  macroName_95.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_95,(SourceLineInfo *)local_4c8,
             capturedExpression_95,ContinueOnFailure);
  local_3d8._vptr_ITransientExpression = (_func_int **)0x4032000000000000;
  pcVar15 = (char *)(CONCAT44(local_4e8._12_4_,local_4e8._8_4_) - local_4e8._0_8_ >> 3);
  if (local_508 + 2 < pcVar15) {
    pcVar15 = local_508 + 2;
  }
  pcVar16 = (char *)0x3;
  if ((long)pcVar15 < 3) {
    pcVar16 = pcVar15;
  }
  local_480._M_current = (double *)(local_4e8._0_8_ + pcVar16 * 8);
  lVar17 = (long)pcVar15 * 8 + (long)pcVar16 * -8;
  local_488 = (double *)(local_4e8._0_8_ + pcVar15 * 8);
  local_478 = (WithinRelMatcher *)0x2;
  lVar11 = lVar17 >> 3;
  lVar11 = lVar11 - (lVar11 - (lVar17 >> 0x3f) & 0xfffffffffffffffeU);
  local_470[0] = 2 - lVar11;
  if (lVar11 == 0) {
    local_470[0] = 0;
  }
  local_288 = local_490;
  local_290._M_current = local_480._M_current;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_288,&local_290,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_4c8,*local_290._M_current);
  bVar10 = Catch::Matchers::WithinRelMatcher::match
                     ((WithinRelMatcher *)local_4c8,(double *)&local_3d8);
  local_458._1_1_ = bVar10;
  local_458._0_1_ = true;
  local_460 = (undefined1  [8])&PTR_streamReconstructedExpression_001f52a8;
  local_450._M_current = (double *)&local_3d8;
  local_448 = (WithinRelMatcher *)local_4c8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_460);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_460);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x291;
  capturedExpression_96.m_size = 0x33;
  capturedExpression_96.m_start = "22., WithinRel( subsection2.probabilities()[1][0] )";
  macroName_96.m_size = 10;
  macroName_96.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_96,(SourceLineInfo *)local_4c8,
             capturedExpression_96,ContinueOnFailure);
  local_258._vptr_ITransientExpression = (_func_int **)0x4036000000000000;
  local_478 = (WithinRelMatcher *)(local_508 + 2);
  local_480._M_current = (double *)local_4e8;
  local_470[0] = 0x300000000;
  local_470[1] = 0x200000000;
  local_3d8._vptr_ITransientExpression = (_func_int **)local_4e8._0_8_;
  local_3d8.m_isBinaryExpression = false;
  local_3d8.m_result = false;
  local_3d8._10_6_ = 0;
  local_3c8 = (iterator_t<CRng> *)local_478;
  local_3b8 = local_470;
  ranges::
  basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::adaptor<true>>>,ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>,ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,int>>,ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,int>>>>>::adaptor<false>>>
  ::operator[]<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
              *)local_460,&local_3d8,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_4c8,*local_450._M_current);
  local_277 = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_4c8,(double *)&local_258);
  local_280[8] = true;
  local_280._0_8_ = &PTR_streamReconstructedExpression_001f52a8;
  local_270._M_current = (double *)&local_258;
  local_268 = (WithinRelMatcher *)local_4c8;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_280);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_280);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x292;
  capturedExpression_97.m_size = 0x33;
  capturedExpression_97.m_start = "24., WithinRel( subsection2.probabilities()[1][1] )";
  macroName_97.m_size = 10;
  macroName_97.m_start = "CHECK_THAT";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_97,(SourceLineInfo *)local_4c8,
             capturedExpression_97,ContinueOnFailure);
  local_388 = 24.0;
  local_478 = (WithinRelMatcher *)(local_508 + 2);
  local_480._M_current = (double *)local_4e8;
  local_470[0] = 0x300000000;
  local_470[1] = 0x200000000;
  local_460 = (undefined1  [8])local_4e8._0_8_;
  local_458 = (double *)0x0;
  local_450._M_current = (double *)local_478;
  local_440 = local_470;
  ranges::
  basic_iterator<ranges::adaptor_cursor<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::adaptor<true>>>,ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>,ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,int>>,ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,int>>>>>::adaptor<false>>>
  ::operator[]<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<basic_iterator<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>,_adaptor<false>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>_conflict
              *)local_280,local_460,1);
  local_460 = (undefined1  [8])local_270._M_current;
  local_458 = (double *)local_280;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_458,(iterator_t<CRng> *)local_460,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_4c8,*(double *)local_460);
  local_258.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_4c8,&local_388);
  local_258.m_isBinaryExpression = true;
  local_258._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001f52a8;
  local_248 = &local_388;
  local_240 = (WithinRelMatcher *)local_4c8;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_560,&local_258);
  Catch::ITransientExpression::~ITransientExpression(&local_258);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  local_4c8 = (undefined1  [8])0x1b05a4;
  local_4c0 = (pointer)0x294;
  capturedExpression_98.m_size = 0xf;
  capturedExpression_98.m_start = "8 == chunk.NC()";
  macroName_98.m_size = 5;
  macroName_98.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_560,macroName_98,(SourceLineInfo *)local_4c8,
             capturedExpression_98,ContinueOnFailure);
  local_4b0._8_8_ =
       njoy::ENDFtk::
       InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
       ::NC(local_3e0);
  local_4c0._1_1_ = local_4b0._8_8_ == 8;
  local_4c0._0_1_ = true;
  local_4c8 = (undefined1  [8])&PTR_streamReconstructedExpression_001f5228;
  local_4c0._4_4_ = 8;
  local_4b8 = (double *)0x1b3ad1;
  local_4b0._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_560,(ITransientExpression *)local_4c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_4c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_560);
  if (local_525 == false) {
    (*local_520->_vptr_IResultCapture[0x13])();
  }
  if ((_func_int **)local_4e8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_4e8._0_8_,(long)local_4d8 - local_4e8._0_8_);
  }
  if ((double *)local_408._0_8_ != (double *)0x0) {
    operator_delete((void *)local_408._0_8_,(long)local_3f8 - local_408._0_8_);
  }
  return;
}

Assistant:

void verifyChunkWithLANG14( const ContinuumEnergyAngle& chunk ) {

  CHECK( 1 == chunk.LAW() );
  CHECK( 2 == chunk.LEP() );
  CHECK( 2 == chunk.NE() );
  CHECK( 2 == chunk.numberIncidentEnergies() );
  CHECK( 1 == chunk.NR() );
  CHECK( 1 == chunk.numberInterpolationRegions() );
  CHECK( 1 == chunk.INT().size() );
  CHECK( 1 == chunk.NBT().size() );
  CHECK( 1 == chunk.INT()[0] );
  CHECK( 2 == chunk.NBT()[0] );
  CHECK( 1 == chunk.interpolants().size() );
  CHECK( 1 == chunk.boundaries().size() );
  CHECK( 1 == chunk.interpolants()[0] );
  CHECK( 2 == chunk.boundaries()[0] );

  auto energies = chunk.distributions();

  auto subsection1 = std::get< TabulatedDistribution >( energies[0] );
  CHECK_THAT( 1e-5, WithinRel( subsection1.E() ) );
  CHECK_THAT( 1e-5, WithinRel( subsection1.incidentEnergy() ) );
  CHECK( 14 == subsection1.LANG() );
  CHECK( 14 == subsection1.representation() );
  CHECK( 0 == subsection1.ND() );
  CHECK( 0 == subsection1.numberDiscreteEnergies() );
  CHECK( 4 == subsection1.NA() );
  CHECK( 4 == subsection1.numberAngularParameters() );
  CHECK( 12 == subsection1.NW() );
  CHECK( 2 == subsection1.NEP() );
  CHECK( 2 == subsection1.numberSecondaryEnergies() );
  CHECK( 2 == subsection1.EP().size() );
  CHECK( 2 == subsection1.energies().size() );
  CHECK_THAT( 1., WithinRel( subsection1.EP()[0] ) );
  CHECK_THAT( 7., WithinRel( subsection1.EP()[1] ) );
  CHECK_THAT( 1., WithinRel( subsection1.energies()[0] ) );
  CHECK_THAT( 7., WithinRel( subsection1.energies()[1] ) );
  CHECK( 2 == subsection1.F0().size() );
  CHECK( 2 == subsection1.totalEmissionProbabilities().size() );
  CHECK_THAT( 2., WithinRel( subsection1.F0()[0] ) );
  CHECK_THAT( 8., WithinRel( subsection1.F0()[1] ) );
  CHECK_THAT( 2., WithinRel( subsection1.totalEmissionProbabilities()[0] ) );
  CHECK_THAT( 8., WithinRel( subsection1.totalEmissionProbabilities()[1] ) );
  CHECK( 2 == subsection1.MU().size() );
  CHECK( 2 == subsection1.cosines().size() );
  CHECK_THAT( 3., WithinRel( subsection1.MU()[0][0] ) );
  CHECK_THAT( 5., WithinRel( subsection1.MU()[0][1] ) );
  CHECK_THAT( 9., WithinRel( subsection1.MU()[1][0] ) );
  CHECK_THAT( 11., WithinRel( subsection1.MU()[1][1] ) );
  CHECK_THAT( 3., WithinRel( subsection1.cosines()[0][0] ) );
  CHECK_THAT( 5., WithinRel( subsection1.cosines()[0][1] ) );
  CHECK_THAT( 9., WithinRel( subsection1.cosines()[1][0] ) );
  CHECK_THAT( 11., WithinRel( subsection1.cosines()[1][1] ) );
  CHECK( 2 == subsection1.F().size() );
  CHECK( 2 == subsection1.probabilities().size() );
  CHECK_THAT( 4., WithinRel( subsection1.F()[0][0] ) );
  CHECK_THAT( 6., WithinRel( subsection1.F()[0][1] ) );
  CHECK_THAT( 10., WithinRel( subsection1.F()[1][0] ) );
  CHECK_THAT( 12., WithinRel( subsection1.F()[1][1] ) );
  CHECK_THAT( 4., WithinRel( subsection1.probabilities()[0][0] ) );
  CHECK_THAT( 6., WithinRel( subsection1.probabilities()[0][1] ) );
  CHECK_THAT( 10., WithinRel( subsection1.probabilities()[1][0] ) );
  CHECK_THAT( 12., WithinRel( subsection1.probabilities()[1][1] ) );

  auto subsection2 = std::get< TabulatedDistribution >( energies[1] );
  CHECK_THAT( 2e+7, WithinRel( subsection2.E() ) );
  CHECK_THAT( 2e+7, WithinRel( subsection2.incidentEnergy() ) );
  CHECK( 14 == subsection2.LANG() );
  CHECK( 0 == subsection2.ND() );
  CHECK( 0 == subsection2.numberDiscreteEnergies() );
  CHECK( 4 == subsection2.NA() );
  CHECK( 4 == subsection2.numberAngularParameters() );
  CHECK( 12 == subsection2.NW() );
  CHECK( 2 == subsection2.NEP() );
  CHECK( 2 == subsection2.numberSecondaryEnergies() );
  CHECK( 2 == subsection2.EP().size() );
  CHECK( 2 == subsection2.energies().size() );
  CHECK_THAT( 13., WithinRel( subsection2.EP()[0] ) );
  CHECK_THAT( 19., WithinRel( subsection2.EP()[1] ) );
  CHECK_THAT( 13., WithinRel( subsection2.energies()[0] ) );
  CHECK_THAT( 19., WithinRel( subsection2.energies()[1] ) );
  CHECK( 2 == subsection2.F0().size() );
  CHECK( 2 == subsection2.totalEmissionProbabilities().size() );
  CHECK_THAT( 14., WithinRel( subsection2.F0()[0] ) );
  CHECK_THAT( 20., WithinRel( subsection2.F0()[1] ) );
  CHECK_THAT( 14., WithinRel( subsection2.totalEmissionProbabilities()[0] ) );
  CHECK_THAT( 20., WithinRel( subsection2.totalEmissionProbabilities()[1] ) );
  CHECK( 2 == subsection2.MU().size() );
  CHECK( 2 == subsection2.cosines().size() );
  CHECK_THAT( 15., WithinRel( subsection2.MU()[0][0] ) );
  CHECK_THAT( 17., WithinRel( subsection2.MU()[0][1] ) );
  CHECK_THAT( 21., WithinRel( subsection2.MU()[1][0] ) );
  CHECK_THAT( 23., WithinRel( subsection2.MU()[1][1] ) );
  CHECK_THAT( 15., WithinRel( subsection2.cosines()[0][0] ) );
  CHECK_THAT( 17., WithinRel( subsection2.cosines()[0][1] ) );
  CHECK_THAT( 21., WithinRel( subsection2.cosines()[1][0] ) );
  CHECK_THAT( 23., WithinRel( subsection2.cosines()[1][1] ) );
  CHECK( 2 == subsection2.F().size() );
  CHECK( 2 == subsection2.probabilities().size() );
  CHECK_THAT( 16., WithinRel( subsection2.F()[0][0] ) );
  CHECK_THAT( 18., WithinRel( subsection2.F()[0][1] ) );
  CHECK_THAT( 22., WithinRel( subsection2.F()[1][0] ) );
  CHECK_THAT( 24., WithinRel( subsection2.F()[1][1] ) );
  CHECK_THAT( 16., WithinRel( subsection2.probabilities()[0][0] ) );
  CHECK_THAT( 18., WithinRel( subsection2.probabilities()[0][1] ) );
  CHECK_THAT( 22., WithinRel( subsection2.probabilities()[1][0] ) );
  CHECK_THAT( 24., WithinRel( subsection2.probabilities()[1][1] ) );

  CHECK( 8 == chunk.NC() );
}